

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint dilation_h;
  uint stride_w;
  int iVar2;
  size_t sVar3;
  Layer *pLVar4;
  uint nT;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int iVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  int iVar18;
  undefined4 uVar19;
  int iVar20;
  undefined4 uVar21;
  int iVar22;
  int iVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  int iVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  int iVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  int iVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  int iVar39;
  int iVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  int iVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  void *__ptr;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  int iVar52;
  int iVar53;
  long lVar54;
  int *piVar55;
  int iVar56;
  Mat *B;
  float *pfVar57;
  float *pfVar58;
  uint uVar59;
  ulong uVar60;
  float *pfVar61;
  uint uVar62;
  int iVar63;
  int iVar64;
  float *pfVar65;
  long lVar66;
  Option *pOVar67;
  int iVar68;
  float *pfVar69;
  int iVar70;
  uint uVar71;
  long lVar72;
  ulong uVar73;
  bool bVar74;
  undefined4 *puVar75;
  float *pfVar76;
  int iVar77;
  long lVar78;
  int iVar79;
  int iVar80;
  uint uVar81;
  ulong uVar83;
  long lVar84;
  byte bVar85;
  Option *pOVar86;
  long lVar87;
  long lVar88;
  undefined1 (*pauVar89) [16];
  float *pfVar90;
  float *pfVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  float fVar94;
  undefined4 uVar101;
  undefined4 uVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined8 uVar105;
  undefined1 auVar99 [16];
  undefined8 uVar106;
  undefined1 auVar100 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  ulong uVar152;
  ulong uVar153;
  int local_1d8;
  Mat local_1b8;
  int local_16c;
  int TILE_N;
  int TILE_M;
  ulong local_160;
  ulong local_158;
  long local_150;
  Mat local_148;
  float *local_f8;
  ulong local_f0;
  long local_e8;
  uint local_e0;
  int TILE_K;
  Mat local_d8;
  ulong local_90;
  size_t local_88;
  Option *local_80;
  Option *local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  ulong local_38;
  ulong uVar82;
  undefined8 uVar95;
  undefined8 uVar96;
  
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).int8_scale_term != 0)) {
    iVar52 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar52;
  }
  iVar52 = (this->super_Convolution).kernel_w;
  iVar77 = (this->super_Convolution).kernel_h;
  if (iVar77 != 1 || (iVar52 != 1 || bottom_blob->dims != 1)) {
    iVar80 = bottom_blob->c;
    iVar79 = (this->super_Convolution).dilation_w;
    uVar73 = bottom_blob->elemsize;
    iVar68 = (this->super_Convolution).dilation_h;
    pOVar86 = (Option *)(long)bottom_blob->elempack;
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Convolution::make_padding(&this->super_Convolution,bottom_blob,&local_1b8,opt);
    iVar63 = local_1b8.h;
    iVar64 = local_1b8.w;
    if ((local_1b8.data == (void *)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0)) {
      local_1d8 = -100;
    }
    else {
      iVar79 = (~((iVar52 + -1) * iVar79) + local_1b8.w) / (this->super_Convolution).stride_w + 1;
      iVar77 = (~((iVar77 + -1) * iVar68) + local_1b8.h) / (this->super_Convolution).stride_h + 1;
      uVar71 = (this->super_Convolution).num_output;
      bVar85 = (uVar71 & 3) == 0 & opt->use_packing_layout;
      iVar52 = (uint)bVar85 + (uint)bVar85 * 2 + 1;
      Mat::create(top_blob,iVar79,iVar77,(int)uVar71 / iVar52,
                  uVar73 / (ulong)pOVar86 << bVar85 * '\x02',iVar52,opt->blob_allocator);
      local_1d8 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (((opt->use_packing_layout == false) &&
            ((((((this->super_Convolution).kernel_w == (this->super_Convolution).kernel_h &&
                (iVar52 = (this->super_Convolution).dilation_w, iVar52 != 1)) &&
               (iVar68 = (this->super_Convolution).dilation_h, iVar68 <= iVar77)) &&
              ((iVar52 <= iVar79 && (iVar68 == iVar52)))) &&
             ((this->super_Convolution).stride_w == 1)))) &&
           ((this->super_Convolution).stride_h == 1)) {
          local_1d8 = forwardDilation_x86(this,&local_1b8,top_blob,opt);
        }
        else {
          iVar80 = iVar80 * (int)pOVar86;
          bVar51 = opt->use_winograd23_convolution;
          if (((bVar51 == false) && (opt->use_winograd43_convolution == false)) &&
             (opt->use_winograd63_convolution != true)) {
            bVar49 = false;
          }
          else {
            bVar49 = true;
            if (iVar80 < 9) {
              bVar49 = 8 < (this->super_Convolution).num_output;
            }
          }
          auVar97._0_4_ = -(uint)((this->super_Convolution).kernel_w == 3);
          auVar97._4_4_ = -(uint)((this->super_Convolution).kernel_h == 3);
          auVar97._8_4_ = -(uint)((this->super_Convolution).dilation_w == 1);
          auVar97._12_4_ = -(uint)((this->super_Convolution).dilation_h == 1);
          iVar52 = movmskps((int)opt,auVar97);
          if ((((iVar52 == 0xf) && ((this->super_Convolution).stride_w == 1)) &&
              ((this->super_Convolution).stride_h == 1)) &&
             ((opt->use_winograd_convolution != false && (bVar49)))) {
            iVar52 = (this->super_Convolution).num_output;
            bVar49 = test_prefer_winograd63(iVar80,iVar52,iVar64,iVar63);
            bVar50 = test_prefer_winograd23(iVar80,iVar52,iVar64,iVar63);
            if ((bVar50) &&
               (((bVar51 == false || ((this->weight_winograd23_data).data == (void *)0x0)) ||
                ((long)(this->weight_winograd23_data).c * (this->weight_winograd23_data).cstep == 0)
                ))) {
              bVar51 = true;
              bVar50 = false;
              bVar48 = false;
              if (bVar49) {
LAB_001590eb:
                bVar48 = false;
                if (((opt->use_winograd63_convolution != true) ||
                    ((this->weight_winograd63_data).data == (void *)0x0)) ||
                   (bVar49 = (long)(this->weight_winograd63_data).c *
                             (this->weight_winograd63_data).cstep == 0, bVar48 = !bVar49,
                   bVar51 || bVar49)) goto LAB_0015912e;
LAB_0015917d:
                bVar74 = true;
              }
              else {
LAB_0015912e:
                bVar74 = bVar48;
                if (((opt->use_winograd43_convolution == true) &&
                    ((this->weight_winograd43_data).data != (void *)0x0)) &&
                   (bVar51 = true,
                   (long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep !=
                   0)) goto LAB_00159187;
                if (((opt->use_winograd63_convolution == true) &&
                    ((this->weight_winograd63_data).data != (void *)0x0)) &&
                   ((long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep !=
                    0)) goto LAB_0015917d;
                bVar50 = true;
              }
              bVar51 = false;
            }
            else {
              if (bVar49) {
                bVar51 = !bVar50 && !bVar49;
                goto LAB_001590eb;
              }
              bVar74 = false;
              bVar51 = false;
              bVar48 = false;
              if (!bVar50 && !bVar49) goto LAB_0015912e;
            }
LAB_00159187:
            iVar52 = this->nT;
            iVar77 = iVar52;
            if (iVar52 == 0) {
              iVar77 = opt->num_threads;
            }
            if (opt->num_threads != iVar52 && iVar52 != 0) {
              forward();
            }
            if (bVar50 == false) {
              if (bVar51) {
                local_1d8 = conv3x3s1_winograd43
                                      (&local_1b8,top_blob,&this->weight_winograd43_data,
                                       &(this->super_Convolution).bias_data,iVar77,opt);
                goto LAB_0015a784;
              }
              if (bVar74) {
                local_1d8 = conv3x3s1_winograd63
                                      (&local_1b8,top_blob,&this->weight_winograd63_data,
                                       &(this->super_Convolution).bias_data,iVar77,opt);
                goto LAB_0015a784;
              }
            }
            else {
              local_1d8 = conv3x3s1_winograd23
                                    (&local_1b8,top_blob,&this->weight_winograd23_data,
                                     &(this->super_Convolution).bias_data,iVar77,opt);
LAB_0015a784:
              if (local_1d8 != 0) goto LAB_001581f0;
            }
            pLVar4 = this->activation;
            local_1d8 = 0;
            if (pLVar4 != (Layer *)0x0) {
              (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
            }
          }
          else {
            iVar77 = get_cpu_level2_cache_size();
            iVar52 = (this->super_Convolution).num_output;
            uVar71 = (this->super_Convolution).kernel_w;
            pOVar67 = (Option *)(ulong)uVar71;
            uVar81 = (this->super_Convolution).kernel_h;
            uVar62 = (this->super_Convolution).dilation_w;
            dilation_h = (this->super_Convolution).dilation_h;
            stride_w = (this->super_Convolution).stride_w;
            uVar59 = (this->super_Convolution).stride_h;
            if (((opt->use_sgemm_convolution != true) ||
                ((int)(stride_w * uVar59 * uVar81 * uVar62 * dilation_h * iVar52 * uVar71 * iVar80 *
                      8) <= iVar77 && (iVar80 < 0x11 && iVar52 < 0x11))) &&
               (uVar81 != 1 || uVar71 != 1)) {
              if (bVar85 == 1 && (int)pOVar86 == 1) {
                bVar51 = uVar81 != 3 || uVar71 != 3;
                if ((uVar59 != 1 || stride_w != 1) || (dilation_h != 1 || (uVar62 != 1 || bVar51)))
                {
                  if ((dilation_h != 1 || (uVar62 != 1 || bVar51)) || (uVar59 != 2 || stride_w != 2)
                     ) goto LAB_0015aba0;
                  conv3x3s2_pack1to4_sse
                            (&local_1b8,top_blob,&this->weight_data_tm,
                             (Mat *)(this->super_Convolution).bias_data.data,pOVar67);
                }
                else {
                  conv3x3s1_pack1to4_sse
                            (&local_1b8,top_blob,&this->weight_data_tm,
                             (Mat *)(this->super_Convolution).bias_data.data,pOVar67);
                }
                pLVar4 = this->activation;
                if (pLVar4 != (Layer *)0x0) {
                  (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
                }
              }
              else {
LAB_0015aba0:
                convolution_packed(&local_1b8,top_blob,&this->weight_data_tm,
                                   &(this->super_Convolution).bias_data,uVar71,uVar81,uVar62,
                                   dilation_h,stride_w,uVar59,
                                   (this->super_Convolution).activation_type,
                                   &(this->super_Convolution).activation_params,pOVar86);
              }
              local_1d8 = 0;
              goto LAB_001581f0;
            }
            uVar71 = this->nT;
            nT = uVar71;
            if (uVar71 == 0) {
              nT = opt->num_threads;
            }
            if (opt->num_threads != uVar71 && uVar71 != 0) {
              fprintf(_stderr,
                      "opt.num_threads %d changed, convolution gemm will use load-time value %d");
              fputc(10,_stderr);
              pOVar67 = (Option *)(ulong)(uint)(this->super_Convolution).kernel_w;
              uVar81 = (this->super_Convolution).kernel_h;
              uVar62 = (this->super_Convolution).dilation_w;
              dilation_h = (this->super_Convolution).dilation_h;
              stride_w = (this->super_Convolution).stride_w;
              uVar59 = (this->super_Convolution).stride_h;
            }
            local_68 = (ulong)dilation_h;
            local_f0 = (ulong)uVar62;
            local_158 = (ulong)uVar59;
            local_70 = (ulong)stride_w;
            local_80 = (Option *)(ulong)uVar81;
            uVar59 = top_blob->elempack * top_blob->c;
            uVar83 = (ulong)uVar59;
            uVar62 = top_blob->h * top_blob->w;
            uVar73 = (ulong)uVar62;
            uVar81 = uVar81 * (int)pOVar67 * local_1b8.c * local_1b8.elempack;
            uVar82 = (ulong)uVar81;
            local_78 = pOVar67;
            local_50 = (ulong)nT;
            convolution_im2col_gemm_get_optimal_tile_mnk
                      (uVar59,uVar62,uVar81,&TILE_M,&TILE_N,&TILE_K,nT);
            iVar52 = TILE_K;
            uVar71 = TILE_N;
            local_90 = (ulong)(uint)TILE_M;
            local_e0 = (int)(uVar59 + TILE_M + -1) / TILE_M;
            iVar77 = (int)(TILE_N + uVar62 + -1) / TILE_N;
            iVar80 = (int)(uVar81 + TILE_K + -1) / TILE_K;
            local_148.cstep = 0;
            local_148.data = (void *)0x0;
            local_148.refcount._0_4_ = 0;
            local_148.refcount._4_4_ = 0;
            local_148.elemsize._0_4_ = 0;
            local_148.elemsize._4_4_ = 0;
            local_148.elempack = 0;
            local_148.allocator = (Allocator *)0x0;
            local_148.dims = 0;
            local_148.w = 0;
            local_148.h = 0;
            local_148.d = 0;
            local_148.c = 0;
            local_150 = CONCAT44(local_150._4_4_,iVar80);
            Mat::create(&local_148,TILE_K * TILE_N,iVar80,iVar77,4,opt->workspace_allocator);
            local_1d8 = -100;
            if ((local_148.data != (void *)0x0) &&
               (local_38 = uVar83, (long)local_148.c * local_148.cstep != 0)) {
              iVar77 = iVar77 * (int)local_150;
              local_e8 = CONCAT44(local_e8._4_4_,iVar77);
              local_160 = uVar73;
              if (0 < iVar77) {
                iVar77 = (int)local_78;
                iVar80 = (int)local_80;
                bVar50 = iVar80 == 1 && iVar77 == 1;
                bVar51 = (int)local_68 == 1 && (int)local_f0 == 1;
                bVar74 = (int)local_158 == 1 && (int)local_70 == 1;
                local_40 = CONCAT71(local_40._1_7_,(bVar50 && bVar51) && bVar74);
                bVar49 = (int)local_158 == 2 && (int)local_70 == 2;
                local_48 = CONCAT71(local_48._1_7_,bVar50 && bVar49);
                bVar50 = (iVar80 == 3 && iVar77 == 3) && bVar51;
                local_60 = CONCAT71(local_60._1_7_,bVar50 && bVar74);
                local_88 = CONCAT71(local_88._1_7_,bVar50 && bVar49);
                bVar50 = (iVar80 == 5 && iVar77 == 5) && bVar51;
                local_f8 = (float *)CONCAT71(local_f8._1_7_,bVar74 && bVar50);
                local_16c = CONCAT31(local_16c._1_3_,bVar50 && bVar49);
                local_58 = CONCAT71(local_58._1_7_,
                                    ((iVar80 == 7 && iVar77 == 7) && bVar51) && bVar49);
                iVar77 = 0;
                do {
                  iVar80 = (iVar77 / (int)local_150) * uVar71;
                  iVar79 = (int)((long)iVar77 % (long)(int)local_150) * iVar52;
                  uVar59 = (int)uVar73 - iVar80;
                  if ((int)uVar71 < (int)uVar59) {
                    uVar59 = uVar71;
                  }
                  iVar68 = (int)uVar82 - iVar79;
                  if (iVar52 < iVar68) {
                    iVar68 = iVar52;
                  }
                  B = (Mat *)((long)local_148.data +
                             ((long)iVar77 % (long)(int)local_150 & 0xffffffffU) * (long)local_148.w
                             * CONCAT44(local_148.elemsize._4_4_,(uint)local_148.elemsize) +
                             (long)(iVar77 / (int)local_150) * local_148.cstep *
                             CONCAT44(local_148.elemsize._4_4_,(uint)local_148.elemsize));
                  if ((char)local_40 == '\0') {
                    if ((char)local_48 == '\0') {
                      if ((char)local_60 != '\0') {
                        uVar153 = 1;
                        uVar83 = 1;
LAB_00158ffb:
                        pOVar86 = (Option *)0x3;
                        goto LAB_00159002;
                      }
                      if ((char)local_88 != '\0') {
                        uVar153 = 2;
                        uVar83 = 2;
                        goto LAB_00158ffb;
                      }
                      if ((char)local_f8 != '\0') {
                        uVar153 = 1;
                        uVar83 = 1;
LAB_0015906a:
                        pOVar86 = (Option *)0x5;
                        goto LAB_00159002;
                      }
                      if ((char)local_16c != '\0') {
                        uVar153 = 2;
                        uVar83 = 2;
                        goto LAB_0015906a;
                      }
                      pOVar86 = local_78;
                      pOVar67 = local_80;
                      uVar60 = local_f0;
                      uVar152 = local_68;
                      uVar83 = local_70;
                      uVar153 = local_158;
                      if ((char)local_58 != '\0') {
                        uVar153 = 2;
                        uVar83 = 2;
                        pOVar86 = (Option *)0x7;
                        goto LAB_00159002;
                      }
                    }
                    else {
                      uVar153 = 2;
                      uVar83 = 2;
                      pOVar86 = (Option *)0x1;
LAB_00159002:
                      pOVar67 = pOVar86;
                      uVar60 = 1;
                      uVar152 = 1;
                    }
                    convolution_im2col_input_tile_impl
                              (&local_1b8,B,iVar80,uVar59,iVar79,iVar68,(int)pOVar86,(int)pOVar67,
                               (int)uVar60,(int)uVar152,(int)uVar83,(int)uVar153);
                  }
                  else {
                    lVar84 = 0;
                    lVar66 = (long)iVar79;
                    lVar54 = (long)iVar80;
                    if (0xb < (int)uVar59) {
                      iVar80 = iVar79 + 3;
                      if (-1 < iVar79) {
                        iVar80 = iVar79;
                      }
                      iVar64 = iVar68 + 3;
                      if (-1 < iVar68) {
                        iVar64 = iVar68;
                      }
                      lVar72 = 0;
                      do {
                        if (local_1b8.elempack == 4) {
                          if (3 < iVar68) {
                            puVar75 = (undefined4 *)
                                      ((long)local_1b8.data +
                                      (lVar72 + lVar54) * 0x10 +
                                      local_1b8.cstep * (long)(iVar80 >> 2) *
                                      CONCAT44(local_1b8.elemsize._4_4_,
                                               (undefined4)local_1b8.elemsize));
                            iVar63 = iVar64 >> 2;
                            do {
                              iVar53 = puVar75[1];
                              iVar56 = puVar75[2];
                              uVar5 = puVar75[4];
                              iVar2 = puVar75[5];
                              uVar6 = puVar75[6];
                              uVar7 = puVar75[8];
                              iVar70 = puVar75[9];
                              uVar8 = puVar75[10];
                              uVar9 = puVar75[0xc];
                              uVar10 = puVar75[0xd];
                              uVar11 = puVar75[0xe];
                              uVar12 = puVar75[0x10];
                              uVar13 = puVar75[0x11];
                              iVar14 = puVar75[0x12];
                              uVar15 = puVar75[0x13];
                              uVar16 = puVar75[0x14];
                              uVar17 = puVar75[0x15];
                              iVar18 = puVar75[0x16];
                              uVar19 = puVar75[0x17];
                              iVar20 = puVar75[0x18];
                              uVar21 = puVar75[0x19];
                              iVar22 = puVar75[0x1a];
                              iVar23 = puVar75[0x1b];
                              uVar24 = puVar75[0x1c];
                              uVar25 = puVar75[0x1d];
                              iVar26 = puVar75[0x1e];
                              uVar27 = puVar75[0x1f];
                              uVar28 = puVar75[0x20];
                              uVar29 = puVar75[0x21];
                              iVar30 = puVar75[0x22];
                              uVar31 = puVar75[0x23];
                              uVar32 = puVar75[0x24];
                              uVar33 = puVar75[0x25];
                              uVar34 = puVar75[0x26];
                              uVar35 = puVar75[0x27];
                              iVar36 = puVar75[0x28];
                              uVar37 = puVar75[0x29];
                              uVar38 = puVar75[0x2a];
                              iVar39 = puVar75[0x2b];
                              iVar40 = puVar75[0x2c];
                              uVar41 = puVar75[0x2d];
                              uVar42 = puVar75[0x2e];
                              iVar43 = puVar75[0x2f];
                              auVar98._4_4_ = uVar11;
                              auVar98._0_4_ = uVar8;
                              auVar98._8_4_ = puVar75[0xb];
                              auVar98._12_4_ = puVar75[0xf];
                              uVar105 = auVar98._8_8_;
                              uVar101 = puVar75[7];
                              uVar92 = puVar75[3];
                              uVar95 = CONCAT44(uVar101,uVar92);
                              *(undefined4 *)&B->data = *puVar75;
                              *(undefined4 *)((long)&B->data + 4) = uVar5;
                              *(undefined4 *)&B->refcount = uVar7;
                              *(undefined4 *)((long)&B->refcount + 4) = uVar9;
                              *(undefined4 *)&B->elemsize = uVar12;
                              *(undefined4 *)((long)&B->elemsize + 4) = uVar16;
                              B->elempack = iVar20;
                              *(undefined4 *)&B->field_0x1c = uVar24;
                              *(undefined4 *)&B->allocator = uVar28;
                              *(undefined4 *)((long)&B->allocator + 4) = uVar32;
                              B->dims = iVar36;
                              B->w = iVar40;
                              B->h = iVar53;
                              B->d = iVar2;
                              B->c = iVar70;
                              *(undefined4 *)&B->field_0x3c = uVar10;
                              *(undefined4 *)&B->cstep = uVar13;
                              *(undefined4 *)((long)&B->cstep + 4) = uVar17;
                              *(undefined4 *)&B[1].data = uVar21;
                              *(undefined4 *)((long)&B[1].data + 4) = uVar25;
                              *(undefined4 *)&B[1].refcount = uVar29;
                              *(undefined4 *)((long)&B[1].refcount + 4) = uVar33;
                              *(undefined4 *)&B[1].elemsize = uVar37;
                              *(undefined4 *)((long)&B[1].elemsize + 4) = uVar41;
                              B[1].elempack = iVar56;
                              *(undefined4 *)&B[1].field_0x1c = uVar6;
                              *(undefined4 *)&B[1].allocator = uVar8;
                              *(undefined4 *)((long)&B[1].allocator + 4) = uVar11;
                              B[1].dims = iVar14;
                              B[1].w = iVar18;
                              B[1].h = iVar22;
                              B[1].d = iVar26;
                              B[1].c = iVar30;
                              *(undefined4 *)&B[1].field_0x3c = uVar34;
                              *(undefined4 *)&B[1].cstep = uVar38;
                              *(undefined4 *)((long)&B[1].cstep + 4) = uVar42;
                              B[2].data = (void *)uVar95;
                              B[2].refcount = (int *)uVar105;
                              *(undefined4 *)&B[2].elemsize = uVar15;
                              *(undefined4 *)((long)&B[2].elemsize + 4) = uVar19;
                              B[2].elempack = iVar23;
                              *(undefined4 *)&B[2].field_0x1c = uVar27;
                              *(undefined4 *)&B[2].allocator = uVar31;
                              *(undefined4 *)((long)&B[2].allocator + 4) = uVar35;
                              B[2].dims = iVar39;
                              B[2].w = iVar43;
                              B = (Mat *)&B[2].h;
                              puVar75 = puVar75 + local_1b8.cstep * 4;
                              iVar63 = iVar63 + -1;
                              uVar73 = local_160;
                            } while (iVar63 != 0);
                            goto LAB_00158a2f;
                          }
                        }
                        else {
LAB_00158a2f:
                          if (local_1b8.elempack == 1 && 0 < iVar68) {
                            pauVar89 = (undefined1 (*) [16])
                                       ((long)local_1b8.data +
                                       lVar54 * 4 +
                                       lVar72 * 4 +
                                       local_1b8.cstep * lVar66 *
                                       CONCAT44(local_1b8.elemsize._4_4_,
                                                (undefined4)local_1b8.elemsize));
                            iVar63 = iVar68;
                            do {
                              uVar5 = *(undefined4 *)pauVar89[1];
                              uVar6 = *(undefined4 *)(pauVar89[1] + 4);
                              iVar53 = *(int *)(pauVar89[1] + 8);
                              uVar7 = *(undefined4 *)(pauVar89[1] + 0xc);
                              uVar8 = *(undefined4 *)pauVar89[2];
                              uVar9 = *(undefined4 *)(pauVar89[2] + 4);
                              iVar56 = *(int *)(pauVar89[2] + 8);
                              iVar2 = *(int *)(pauVar89[2] + 0xc);
                              *(undefined1 (*) [16])B = *pauVar89;
                              *(undefined4 *)&B->elemsize = uVar5;
                              *(undefined4 *)((long)&B->elemsize + 4) = uVar6;
                              B->elempack = iVar53;
                              *(undefined4 *)&B->field_0x1c = uVar7;
                              *(undefined4 *)&B->allocator = uVar8;
                              *(undefined4 *)((long)&B->allocator + 4) = uVar9;
                              B->dims = iVar56;
                              B->w = iVar2;
                              B = (Mat *)&B->h;
                              pauVar89 = (undefined1 (*) [16])(*pauVar89 + local_1b8.cstep * 4);
                              iVar63 = iVar63 + -1;
                            } while (iVar63 != 0);
                          }
                        }
                        lVar84 = lVar72 + 0xc;
                        uVar83 = lVar72 + 0x17;
                        lVar72 = lVar84;
                      } while (uVar83 < uVar59);
                    }
                    lVar72 = (long)(int)uVar59;
                    if ((int)lVar84 + 7 < (int)uVar59) {
                      iVar80 = iVar79 + 3;
                      if (-1 < iVar79) {
                        iVar80 = iVar79;
                      }
                      iVar64 = iVar68 + 3;
                      if (-1 < iVar68) {
                        iVar64 = iVar68;
                      }
                      lVar88 = (long)(int)lVar84;
                      do {
                        if (local_1b8.elempack == 4) {
                          if (3 < iVar68) {
                            puVar75 = (undefined4 *)
                                      ((long)local_1b8.data +
                                      (lVar54 + lVar88) * 0x10 +
                                      local_1b8.cstep * (long)(iVar80 >> 2) *
                                      CONCAT44(local_1b8.elemsize._4_4_,
                                               (undefined4)local_1b8.elemsize));
                            iVar63 = iVar64 >> 2;
                            do {
                              uVar5 = puVar75[1];
                              uVar6 = puVar75[2];
                              uVar7 = puVar75[3];
                              uVar8 = puVar75[4];
                              uVar9 = puVar75[5];
                              uVar10 = puVar75[6];
                              uVar11 = puVar75[7];
                              uVar12 = puVar75[8];
                              iVar53 = puVar75[9];
                              uVar13 = puVar75[10];
                              uVar15 = puVar75[0xc];
                              iVar56 = puVar75[0xd];
                              uVar16 = puVar75[0xe];
                              uVar17 = puVar75[0x10];
                              iVar2 = puVar75[0x11];
                              uVar19 = puVar75[0x12];
                              iVar70 = puVar75[0x13];
                              uVar21 = puVar75[0x14];
                              iVar14 = puVar75[0x15];
                              uVar24 = puVar75[0x16];
                              iVar18 = puVar75[0x17];
                              iVar20 = puVar75[0x18];
                              iVar22 = puVar75[0x19];
                              uVar25 = puVar75[0x1a];
                              iVar23 = puVar75[0x1b];
                              uVar27 = puVar75[0x1c];
                              uVar28 = puVar75[0x1d];
                              uVar29 = puVar75[0x1e];
                              iVar26 = puVar75[0x1f];
                              auVar99._4_4_ = uVar16;
                              auVar99._0_4_ = uVar13;
                              auVar99._8_4_ = puVar75[0xb];
                              auVar99._12_4_ = puVar75[0xf];
                              uVar106 = auVar99._8_8_;
                              *(undefined4 *)&B->data = *puVar75;
                              *(undefined4 *)((long)&B->data + 4) = uVar8;
                              *(undefined4 *)&B->refcount = uVar12;
                              *(undefined4 *)((long)&B->refcount + 4) = uVar15;
                              *(undefined4 *)&B->elemsize = uVar17;
                              *(undefined4 *)((long)&B->elemsize + 4) = uVar21;
                              B->elempack = iVar20;
                              *(undefined4 *)&B->field_0x1c = uVar27;
                              *(undefined4 *)&B->allocator = uVar5;
                              *(undefined4 *)((long)&B->allocator + 4) = uVar9;
                              B->dims = iVar53;
                              B->w = iVar56;
                              B->h = iVar2;
                              B->d = iVar14;
                              B->c = iVar22;
                              *(undefined4 *)&B->field_0x3c = uVar28;
                              *(undefined4 *)&B->cstep = uVar6;
                              *(undefined4 *)((long)&B->cstep + 4) = uVar10;
                              *(undefined4 *)&B[1].data = uVar13;
                              *(undefined4 *)((long)&B[1].data + 4) = uVar16;
                              *(undefined4 *)&B[1].refcount = uVar19;
                              *(undefined4 *)((long)&B[1].refcount + 4) = uVar24;
                              *(undefined4 *)&B[1].elemsize = uVar25;
                              *(undefined4 *)((long)&B[1].elemsize + 4) = uVar29;
                              B[1].elempack = uVar7;
                              *(undefined4 *)&B[1].field_0x1c = uVar11;
                              B[1].allocator = (Allocator *)uVar106;
                              B[1].dims = iVar70;
                              B[1].w = iVar18;
                              B[1].h = iVar23;
                              B[1].d = iVar26;
                              B = (Mat *)&B[1].c;
                              puVar75 = puVar75 + local_1b8.cstep * 4;
                              iVar63 = iVar63 + -1;
                            } while (iVar63 != 0);
                            goto LAB_00158bd7;
                          }
                        }
                        else {
LAB_00158bd7:
                          if (local_1b8.elempack == 1 && 0 < iVar68) {
                            pauVar89 = (undefined1 (*) [16])
                                       ((long)local_1b8.data +
                                       lVar54 * 4 +
                                       lVar88 * 4 +
                                       local_1b8.cstep * lVar66 *
                                       CONCAT44(local_1b8.elemsize._4_4_,
                                                (undefined4)local_1b8.elemsize));
                            iVar63 = iVar68;
                            do {
                              uVar5 = *(undefined4 *)pauVar89[1];
                              uVar6 = *(undefined4 *)(pauVar89[1] + 4);
                              iVar53 = *(int *)(pauVar89[1] + 8);
                              uVar7 = *(undefined4 *)(pauVar89[1] + 0xc);
                              *(undefined1 (*) [16])B = *pauVar89;
                              *(undefined4 *)&B->elemsize = uVar5;
                              *(undefined4 *)((long)&B->elemsize + 4) = uVar6;
                              B->elempack = iVar53;
                              *(undefined4 *)&B->field_0x1c = uVar7;
                              B = (Mat *)&B->allocator;
                              pauVar89 = (undefined1 (*) [16])(*pauVar89 + local_1b8.cstep * 4);
                              iVar63 = iVar63 + -1;
                            } while (iVar63 != 0);
                          }
                        }
                        lVar84 = lVar88 + 8;
                        bVar51 = lVar88 < lVar72 + -0xf;
                        uVar73 = local_160;
                        lVar88 = lVar84;
                      } while (bVar51);
                    }
                    if ((int)((uint)lVar84 | 3) < (int)uVar59) {
                      iVar80 = iVar79 + 3;
                      if (-1 < iVar79) {
                        iVar80 = iVar79;
                      }
                      iVar64 = iVar68 + 3;
                      if (-1 < iVar68) {
                        iVar64 = iVar68;
                      }
                      lVar88 = (long)(int)(uint)lVar84;
                      do {
                        if (local_1b8.elempack == 4) {
                          if (3 < iVar68) {
                            puVar75 = (undefined4 *)
                                      ((long)local_1b8.data +
                                      (lVar88 + lVar54) * 0x10 +
                                      local_1b8.cstep * (long)(iVar80 >> 2) *
                                      CONCAT44(local_1b8.elemsize._4_4_,
                                               (undefined4)local_1b8.elemsize));
                            iVar63 = iVar64 >> 2;
                            do {
                              uVar5 = puVar75[1];
                              uVar6 = puVar75[4];
                              uVar7 = puVar75[5];
                              uVar8 = puVar75[8];
                              iVar53 = puVar75[9];
                              uVar9 = puVar75[10];
                              uVar10 = puVar75[0xb];
                              uVar11 = puVar75[0xc];
                              uVar12 = puVar75[0xd];
                              uVar13 = puVar75[0xe];
                              uVar15 = puVar75[0xf];
                              auVar100._0_8_ = CONCAT44(puVar75[6],puVar75[2]);
                              auVar100._8_4_ = puVar75[3];
                              auVar100._12_4_ = puVar75[7];
                              *(undefined4 *)&B->data = *puVar75;
                              *(undefined4 *)((long)&B->data + 4) = uVar6;
                              *(undefined4 *)&B->refcount = uVar8;
                              *(undefined4 *)((long)&B->refcount + 4) = uVar11;
                              *(undefined4 *)&B->elemsize = uVar5;
                              *(undefined4 *)((long)&B->elemsize + 4) = uVar7;
                              B->elempack = iVar53;
                              *(undefined4 *)&B->field_0x1c = uVar12;
                              B->allocator = (Allocator *)auVar100._0_8_;
                              B->dims = uVar9;
                              B->w = uVar13;
                              B->h = (int)auVar100._8_8_;
                              B->d = (int)((ulong)auVar100._8_8_ >> 0x20);
                              B->c = uVar10;
                              *(undefined4 *)&B->field_0x3c = uVar15;
                              B = (Mat *)&B->cstep;
                              puVar75 = puVar75 + local_1b8.cstep * 4;
                              iVar63 = iVar63 + -1;
                            } while (iVar63 != 0);
                            goto LAB_00158d1c;
                          }
                        }
                        else {
LAB_00158d1c:
                          if (local_1b8.elempack == 1 && 0 < iVar68) {
                            pauVar89 = (undefined1 (*) [16])
                                       ((long)local_1b8.data +
                                       lVar54 * 4 +
                                       lVar88 * 4 +
                                       local_1b8.cstep * lVar66 *
                                       CONCAT44(local_1b8.elemsize._4_4_,
                                                (undefined4)local_1b8.elemsize));
                            iVar63 = iVar68;
                            do {
                              *(undefined1 (*) [16])B = *pauVar89;
                              B = (Mat *)&B->elemsize;
                              pauVar89 = (undefined1 (*) [16])(*pauVar89 + local_1b8.cstep * 4);
                              iVar63 = iVar63 + -1;
                            } while (iVar63 != 0);
                          }
                        }
                        lVar84 = lVar88 + 4;
                        lVar87 = lVar88 + 7;
                        uVar73 = local_160;
                        lVar88 = lVar84;
                      } while (lVar87 < lVar72);
                    }
                    uVar81 = (uint)lVar84;
                    if ((int)(uVar81 | 1) < (int)uVar59) {
                      iVar80 = iVar79 + 3;
                      if (-1 < iVar79) {
                        iVar80 = iVar79;
                      }
                      iVar64 = iVar68 + 3;
                      if (-1 < iVar68) {
                        iVar64 = iVar68;
                      }
                      lVar88 = lVar54 * 4 + (long)(int)uVar81 * 4;
                      lVar87 = (long)(int)uVar81;
                      do {
                        if (local_1b8.elempack == 4) {
                          if (3 < iVar68) {
                            puVar75 = (undefined4 *)
                                      ((long)local_1b8.data +
                                      (lVar54 + lVar87) * 0x10 +
                                      local_1b8.cstep * (long)(iVar80 >> 2) *
                                      CONCAT44(local_1b8.elemsize._4_4_,
                                               (undefined4)local_1b8.elemsize));
                            iVar63 = iVar64 >> 2;
                            do {
                              uVar5 = puVar75[1];
                              uVar6 = puVar75[3];
                              uVar7 = puVar75[4];
                              uVar8 = puVar75[5];
                              uVar9 = puVar75[7];
                              uVar102 = puVar75[6];
                              uVar93 = puVar75[2];
                              uVar96 = CONCAT44(uVar102,uVar93);
                              *(undefined4 *)&B->data = *puVar75;
                              *(undefined4 *)((long)&B->data + 4) = uVar7;
                              *(undefined4 *)&B->refcount = uVar5;
                              *(undefined4 *)((long)&B->refcount + 4) = uVar8;
                              B->elemsize = uVar96;
                              B->elempack = uVar6;
                              *(undefined4 *)&B->field_0x1c = uVar9;
                              B = (Mat *)&B->allocator;
                              puVar75 = puVar75 + local_1b8.cstep * 4;
                              iVar63 = iVar63 + -1;
                            } while (iVar63 != 0);
                            goto LAB_00158e34;
                          }
                        }
                        else {
LAB_00158e34:
                          if (local_1b8.elempack == 1 && 0 < iVar68) {
                            puVar75 = (undefined4 *)
                                      (local_1b8.cstep * lVar66 *
                                       CONCAT44(local_1b8.elemsize._4_4_,
                                                (undefined4)local_1b8.elemsize) + lVar88 +
                                      (long)local_1b8.data);
                            iVar63 = iVar68;
                            do {
                              *(undefined4 *)&B->data = *puVar75;
                              *(undefined4 *)((long)&B->data + 4) = puVar75[1];
                              B = (Mat *)&B->refcount;
                              puVar75 = puVar75 + local_1b8.cstep;
                              iVar63 = iVar63 + -1;
                            } while (iVar63 != 0);
                          }
                        }
                        lVar84 = lVar87 + 2;
                        lVar78 = lVar87 + 3;
                        lVar88 = lVar88 + 8;
                        uVar73 = local_160;
                        lVar87 = lVar84;
                      } while (lVar78 < lVar72);
                    }
                    if ((int)lVar84 < (int)uVar59) {
                      iVar80 = iVar79 + 3;
                      if (-1 < iVar79) {
                        iVar80 = iVar79;
                      }
                      iVar79 = iVar68 + 3;
                      if (-1 < iVar68) {
                        iVar79 = iVar68;
                      }
                      lVar88 = (long)(int)lVar84;
                      lVar84 = lVar54 * 4 + lVar88 * 4;
                      do {
                        if (local_1b8.elempack == 4) {
                          if (3 < iVar68) {
                            pauVar89 = (undefined1 (*) [16])
                                       ((long)local_1b8.data +
                                       (lVar88 + lVar54) * 0x10 +
                                       local_1b8.cstep * (long)(iVar80 >> 2) *
                                       CONCAT44(local_1b8.elemsize._4_4_,
                                                (undefined4)local_1b8.elemsize));
                            iVar64 = iVar79 >> 2;
                            do {
                              *(undefined1 (*) [16])B = *pauVar89;
                              B = (Mat *)&B->elemsize;
                              pauVar89 = pauVar89 + local_1b8.cstep;
                              iVar64 = iVar64 + -1;
                            } while (iVar64 != 0);
                            goto LAB_00158f3e;
                          }
                        }
                        else {
LAB_00158f3e:
                          if (local_1b8.elempack == 1 && 0 < iVar68) {
                            puVar75 = (undefined4 *)
                                      (local_1b8.cstep * lVar66 *
                                       CONCAT44(local_1b8.elemsize._4_4_,
                                                (undefined4)local_1b8.elemsize) + lVar84 +
                                      (long)local_1b8.data);
                            iVar64 = iVar68;
                            do {
                              *(undefined4 *)&B->data = *puVar75;
                              B = (Mat *)((long)&B->data + 4);
                              puVar75 = puVar75 + local_1b8.cstep;
                              iVar64 = iVar64 + -1;
                            } while (iVar64 != 0);
                          }
                        }
                        lVar88 = lVar88 + 1;
                        lVar84 = lVar84 + 4;
                        uVar73 = local_160;
                      } while (lVar88 != lVar72);
                    }
                  }
                  iVar77 = iVar77 + 1;
                } while (iVar77 != (int)local_e8);
              }
              local_d8.cstep = 0;
              local_d8.data = (void *)0x0;
              local_d8.refcount._0_4_ = 0;
              local_d8.refcount._4_4_ = 0;
              local_d8.elemsize._0_4_ = 0;
              local_d8.elemsize._4_4_ = 0;
              local_d8.elempack = 0;
              local_d8.allocator = (Allocator *)0x0;
              local_d8.dims = 0;
              local_d8.w = 0;
              local_d8.h = 0;
              local_d8.d = 0;
              local_d8.c = 0;
              if (iVar52 < (int)uVar82) {
                Mat::create(&local_d8,(int)local_90 * uVar71,1,(int)local_50,4,
                            opt->workspace_allocator);
                local_1d8 = -100;
                if ((local_d8.data != (void *)0x0) && ((long)local_d8.c * local_d8.cstep != 0))
                goto LAB_001592a5;
              }
              else {
LAB_001592a5:
                if (0 < (int)local_e0) {
                  uVar83 = 0;
                  do {
                    uVar153 = uVar83;
                    iVar77 = TILE_M;
                    if (iVar52 < (int)uVar82) {
                      iVar80 = get_omp_thread_num();
                      local_f8 = (float *)((long)iVar80 * local_d8.cstep *
                                           CONCAT44(local_d8.elemsize._4_4_,(uint)local_d8.elemsize)
                                          + (long)local_d8.data);
                    }
                    else {
                      local_f8 = (float *)0x0;
                    }
                    iVar80 = iVar77 * (int)uVar153;
                    uVar59 = (int)local_38 - iVar80;
                    if (iVar77 < (int)uVar59) {
                      uVar59 = iVar77;
                    }
                    uVar83 = (ulong)uVar59;
                    if (0 < (int)uVar73) {
                      local_150 = (long)iVar80;
                      local_80 = (Option *)(long)(int)uVar59;
                      iVar77 = 0;
                      local_158 = CONCAT44(local_158._4_4_,uVar59);
                      do {
                        uVar81 = (int)uVar73 - iVar77;
                        if ((int)uVar71 < (int)uVar81) {
                          uVar81 = uVar71;
                        }
                        iVar79 = (int)uVar82;
                        if (0 < iVar79) {
                          local_90 = CONCAT44(local_90._4_4_,iVar77);
                          local_60 = (long)iVar77;
                          iVar68 = 0;
                          do {
                            iVar64 = iVar79 - iVar68;
                            local_50 = CONCAT44(local_50._4_4_,iVar64);
                            iVar63 = iVar64;
                            if (iVar52 < iVar64) {
                              iVar63 = iVar52;
                            }
                            sVar3 = (this->weight_sgemm_data).elemsize;
                            pfVar61 = (float *)(this->super_Convolution).bias_data.data;
                            pfVar65 = (float *)((long)(this->weight_sgemm_data).data +
                                               (long)(this->weight_sgemm_data).w * sVar3 *
                                               (long)(iVar68 / iVar52) +
                                               (long)(iVar80 / TILE_M) *
                                               (this->weight_sgemm_data).cstep * sVar3);
                            pfVar57 = (float *)((long)local_148.data +
                                               (long)local_148.w *
                                               CONCAT44(local_148.elemsize._4_4_,
                                                        (uint)local_148.elemsize) *
                                               (long)(iVar68 / iVar52) +
                                               (long)(iVar77 / TILE_N) * local_148.cstep *
                                               CONCAT44(local_148.elemsize._4_4_,
                                                        (uint)local_148.elemsize));
                            iVar53 = iVar68 + iVar52;
                            local_88 = top_blob->cstep;
                            iVar56 = (int)local_88;
                            pfVar69 = local_f8;
                            if ((int)uVar59 < 4) {
                              uVar73 = 0;
                            }
                            else {
                              iVar2 = top_blob->elempack;
                              local_70 = (ulong)(iVar2 * iVar77);
                              lVar54 = (long)iVar56;
                              lVar66 = (long)(iVar56 * 2);
                              lVar84 = (long)((local_88 << 0x20) * 3) >> 0x20;
                              local_e8 = (long)(iVar56 * 3);
                              local_40 = (long)(iVar56 * 2 + 1);
                              local_48 = (long)(iVar56 * 3 + 1);
                              local_78 = (Option *)((long)(iVar63 * 4) * 4);
                              uVar73 = 0;
                              pfVar58 = pfVar61;
                              do {
                                local_68 = uVar73;
                                pfVar61 = (float *)((long)(this->super_Convolution).bias_data.data +
                                                   local_68 * 4 + local_150 * 4);
                                if (pfVar58 == (float *)0x0) {
                                  pfVar61 = pfVar58;
                                }
                                uVar71 = 0;
                                pfVar58 = (float *)((long)top_blob->data +
                                                   local_70 * 4 +
                                                   (local_68 + local_150) * lVar54 * 4);
                                pfVar90 = pfVar57;
                                if (0xb < (int)uVar81) {
                                  uVar62 = 0;
                                  do {
                                    if (iVar68 == 0) {
                                      if (pfVar61 == (float *)0x0) {
                                        fVar108 = 0.0;
                                        fVar109 = 0.0;
                                        fVar110 = 0.0;
                                        fVar111 = 0.0;
                                        fVar94 = 0.0;
                                        fVar103 = 0.0;
                                        fVar104 = 0.0;
                                        fVar107 = 0.0;
                                        fVar120 = 0.0;
                                        fVar121 = 0.0;
                                        fVar122 = 0.0;
                                        fVar123 = 0.0;
                                        fVar116 = 0.0;
                                        fVar117 = 0.0;
                                        fVar118 = 0.0;
                                        fVar119 = 0.0;
                                        fVar128 = 0.0;
                                        fVar129 = 0.0;
                                        fVar130 = 0.0;
                                        fVar131 = 0.0;
                                        fVar112 = 0.0;
                                        fVar113 = 0.0;
                                        fVar114 = 0.0;
                                        fVar115 = 0.0;
                                        fVar136 = 0.0;
                                        fVar137 = 0.0;
                                        fVar138 = 0.0;
                                        fVar139 = 0.0;
                                        fVar132 = 0.0;
                                        fVar133 = 0.0;
                                        fVar134 = 0.0;
                                        fVar135 = 0.0;
                                        fVar140 = 0.0;
                                        fVar141 = 0.0;
                                        fVar142 = 0.0;
                                        fVar143 = 0.0;
                                        fVar124 = 0.0;
                                        fVar125 = 0.0;
                                        fVar126 = 0.0;
                                        fVar127 = 0.0;
                                        fVar148 = 0.0;
                                        fVar149 = 0.0;
                                        fVar150 = 0.0;
                                        fVar151 = 0.0;
                                        fVar144 = 0.0;
                                        fVar145 = 0.0;
                                        fVar146 = 0.0;
                                        fVar147 = 0.0;
                                      }
                                      else {
                                        fVar108 = *pfVar61;
                                        fVar109 = pfVar61[1];
                                        fVar110 = pfVar61[2];
                                        fVar111 = pfVar61[3];
                                        fVar112 = fVar108;
                                        fVar113 = fVar109;
                                        fVar114 = fVar110;
                                        fVar115 = fVar111;
                                        fVar116 = fVar108;
                                        fVar117 = fVar109;
                                        fVar118 = fVar110;
                                        fVar119 = fVar111;
                                        fVar120 = fVar108;
                                        fVar121 = fVar109;
                                        fVar122 = fVar110;
                                        fVar123 = fVar111;
                                        fVar124 = fVar108;
                                        fVar125 = fVar109;
                                        fVar126 = fVar110;
                                        fVar127 = fVar111;
                                        fVar128 = fVar108;
                                        fVar129 = fVar109;
                                        fVar130 = fVar110;
                                        fVar131 = fVar111;
                                        fVar132 = fVar108;
                                        fVar133 = fVar109;
                                        fVar134 = fVar110;
                                        fVar135 = fVar111;
                                        fVar136 = fVar108;
                                        fVar137 = fVar109;
                                        fVar138 = fVar110;
                                        fVar139 = fVar111;
                                        fVar140 = fVar108;
                                        fVar141 = fVar109;
                                        fVar142 = fVar110;
                                        fVar143 = fVar111;
                                        fVar144 = fVar108;
                                        fVar145 = fVar109;
                                        fVar146 = fVar110;
                                        fVar147 = fVar111;
                                        fVar148 = fVar108;
                                        fVar149 = fVar109;
                                        fVar150 = fVar110;
                                        fVar151 = fVar111;
                                        fVar94 = fVar108;
                                        fVar103 = fVar109;
                                        fVar104 = fVar110;
                                        fVar107 = fVar111;
                                      }
                                    }
                                    else {
                                      fVar108 = pfVar69[0x2c];
                                      fVar109 = pfVar69[0x2d];
                                      fVar110 = pfVar69[0x2e];
                                      fVar111 = pfVar69[0x2f];
                                      fVar112 = pfVar69[0x18];
                                      fVar113 = pfVar69[0x19];
                                      fVar114 = pfVar69[0x1a];
                                      fVar115 = pfVar69[0x1b];
                                      fVar116 = pfVar69[0x20];
                                      fVar117 = pfVar69[0x21];
                                      fVar118 = pfVar69[0x22];
                                      fVar119 = pfVar69[0x23];
                                      fVar120 = pfVar69[0x24];
                                      fVar121 = pfVar69[0x25];
                                      fVar122 = pfVar69[0x26];
                                      fVar123 = pfVar69[0x27];
                                      fVar124 = pfVar69[8];
                                      fVar125 = pfVar69[9];
                                      fVar126 = pfVar69[10];
                                      fVar127 = pfVar69[0xb];
                                      fVar128 = pfVar69[0x1c];
                                      fVar129 = pfVar69[0x1d];
                                      fVar130 = pfVar69[0x1e];
                                      fVar131 = pfVar69[0x1f];
                                      fVar132 = pfVar69[0x10];
                                      fVar133 = pfVar69[0x11];
                                      fVar134 = pfVar69[0x12];
                                      fVar135 = pfVar69[0x13];
                                      fVar136 = pfVar69[0x14];
                                      fVar137 = pfVar69[0x15];
                                      fVar138 = pfVar69[0x16];
                                      fVar139 = pfVar69[0x17];
                                      fVar140 = pfVar69[0xc];
                                      fVar141 = pfVar69[0xd];
                                      fVar142 = pfVar69[0xe];
                                      fVar143 = pfVar69[0xf];
                                      fVar144 = *pfVar69;
                                      fVar145 = pfVar69[1];
                                      fVar146 = pfVar69[2];
                                      fVar147 = pfVar69[3];
                                      fVar148 = pfVar69[4];
                                      fVar149 = pfVar69[5];
                                      fVar150 = pfVar69[6];
                                      fVar151 = pfVar69[7];
                                      fVar94 = pfVar69[0x28];
                                      fVar103 = pfVar69[0x29];
                                      fVar104 = pfVar69[0x2a];
                                      fVar107 = pfVar69[0x2b];
                                    }
                                    pfVar76 = pfVar65;
                                    iVar70 = iVar63;
                                    if (0 < iVar63) {
                                      do {
                                        fVar44 = *pfVar76;
                                        fVar45 = pfVar76[1];
                                        fVar46 = pfVar76[2];
                                        fVar47 = pfVar76[3];
                                        fVar1 = *pfVar90;
                                        fVar144 = fVar144 + fVar1 * fVar44;
                                        fVar145 = fVar145 + fVar1 * fVar45;
                                        fVar146 = fVar146 + fVar1 * fVar46;
                                        fVar147 = fVar147 + fVar1 * fVar47;
                                        fVar1 = pfVar90[1];
                                        fVar148 = fVar148 + fVar1 * fVar44;
                                        fVar149 = fVar149 + fVar1 * fVar45;
                                        fVar150 = fVar150 + fVar1 * fVar46;
                                        fVar151 = fVar151 + fVar1 * fVar47;
                                        fVar1 = pfVar90[2];
                                        fVar124 = fVar124 + fVar1 * fVar44;
                                        fVar125 = fVar125 + fVar1 * fVar45;
                                        fVar126 = fVar126 + fVar1 * fVar46;
                                        fVar127 = fVar127 + fVar1 * fVar47;
                                        fVar1 = pfVar90[3];
                                        fVar140 = fVar140 + fVar1 * fVar44;
                                        fVar141 = fVar141 + fVar1 * fVar45;
                                        fVar142 = fVar142 + fVar1 * fVar46;
                                        fVar143 = fVar143 + fVar1 * fVar47;
                                        fVar1 = pfVar90[4];
                                        fVar132 = fVar132 + fVar1 * fVar44;
                                        fVar133 = fVar133 + fVar1 * fVar45;
                                        fVar134 = fVar134 + fVar1 * fVar46;
                                        fVar135 = fVar135 + fVar1 * fVar47;
                                        fVar1 = pfVar90[5];
                                        fVar136 = fVar136 + fVar1 * fVar44;
                                        fVar137 = fVar137 + fVar1 * fVar45;
                                        fVar138 = fVar138 + fVar1 * fVar46;
                                        fVar139 = fVar139 + fVar1 * fVar47;
                                        fVar1 = pfVar90[6];
                                        fVar112 = fVar112 + fVar1 * fVar44;
                                        fVar113 = fVar113 + fVar1 * fVar45;
                                        fVar114 = fVar114 + fVar1 * fVar46;
                                        fVar115 = fVar115 + fVar1 * fVar47;
                                        fVar1 = pfVar90[7];
                                        fVar128 = fVar128 + fVar1 * fVar44;
                                        fVar129 = fVar129 + fVar1 * fVar45;
                                        fVar130 = fVar130 + fVar1 * fVar46;
                                        fVar131 = fVar131 + fVar1 * fVar47;
                                        fVar1 = pfVar90[8];
                                        fVar116 = fVar116 + fVar1 * fVar44;
                                        fVar117 = fVar117 + fVar1 * fVar45;
                                        fVar118 = fVar118 + fVar1 * fVar46;
                                        fVar119 = fVar119 + fVar1 * fVar47;
                                        fVar1 = pfVar90[9];
                                        fVar120 = fVar120 + fVar1 * fVar44;
                                        fVar121 = fVar121 + fVar1 * fVar45;
                                        fVar122 = fVar122 + fVar1 * fVar46;
                                        fVar123 = fVar123 + fVar1 * fVar47;
                                        fVar1 = pfVar90[10];
                                        fVar94 = fVar94 + fVar1 * fVar44;
                                        fVar103 = fVar103 + fVar1 * fVar45;
                                        fVar104 = fVar104 + fVar1 * fVar46;
                                        fVar107 = fVar107 + fVar1 * fVar47;
                                        fVar1 = pfVar90[0xb];
                                        fVar108 = fVar108 + fVar1 * fVar44;
                                        fVar109 = fVar109 + fVar1 * fVar45;
                                        fVar110 = fVar110 + fVar1 * fVar46;
                                        fVar111 = fVar111 + fVar1 * fVar47;
                                        pfVar90 = pfVar90 + 0xc;
                                        iVar70 = iVar70 + -1;
                                        pfVar76 = pfVar76 + 4;
                                      } while (iVar70 != 0);
                                    }
                                    if (iVar53 < iVar79) {
                                      *pfVar69 = fVar144;
                                      pfVar69[1] = fVar145;
                                      pfVar69[2] = fVar146;
                                      pfVar69[3] = fVar147;
                                      pfVar69[4] = fVar148;
                                      pfVar69[5] = fVar149;
                                      pfVar69[6] = fVar150;
                                      pfVar69[7] = fVar151;
                                      pfVar69[8] = fVar124;
                                      pfVar69[9] = fVar125;
                                      pfVar69[10] = fVar126;
                                      pfVar69[0xb] = fVar127;
                                      pfVar69[0xc] = fVar140;
                                      pfVar69[0xd] = fVar141;
                                      pfVar69[0xe] = fVar142;
                                      pfVar69[0xf] = fVar143;
                                      pfVar69[0x10] = fVar132;
                                      pfVar69[0x11] = fVar133;
                                      pfVar69[0x12] = fVar134;
                                      pfVar69[0x13] = fVar135;
                                      pfVar69[0x14] = fVar136;
                                      pfVar69[0x15] = fVar137;
                                      pfVar69[0x16] = fVar138;
                                      pfVar69[0x17] = fVar139;
                                      pfVar69[0x18] = fVar112;
                                      pfVar69[0x19] = fVar113;
                                      pfVar69[0x1a] = fVar114;
                                      pfVar69[0x1b] = fVar115;
                                      pfVar69[0x1c] = fVar128;
                                      pfVar69[0x1d] = fVar129;
                                      pfVar69[0x1e] = fVar130;
                                      pfVar69[0x1f] = fVar131;
                                      pfVar69[0x20] = fVar116;
                                      pfVar69[0x21] = fVar117;
                                      pfVar69[0x22] = fVar118;
                                      pfVar69[0x23] = fVar119;
                                      pfVar69[0x24] = fVar120;
                                      pfVar69[0x25] = fVar121;
                                      pfVar69[0x26] = fVar122;
                                      pfVar69[0x27] = fVar123;
                                      pfVar69[0x28] = fVar94;
                                      pfVar69[0x29] = fVar103;
                                      pfVar69[0x2a] = fVar104;
                                      pfVar69[0x2b] = fVar107;
                                      pfVar69[0x2c] = fVar108;
                                      pfVar69[0x2d] = fVar109;
                                      pfVar69[0x2e] = fVar110;
                                      pfVar69[0x2f] = fVar111;
                                    }
                                    else if (iVar2 == 1) {
                                      *pfVar58 = fVar144;
                                      pfVar58[1] = fVar148;
                                      pfVar58[2] = fVar124;
                                      pfVar58[3] = fVar140;
                                      pfVar76 = pfVar58 + lVar54;
                                      *pfVar76 = fVar145;
                                      pfVar76[1] = fVar149;
                                      pfVar76[2] = fVar125;
                                      pfVar76[3] = fVar141;
                                      pfVar76 = pfVar58 + lVar66;
                                      *pfVar76 = fVar146;
                                      pfVar76[1] = fVar150;
                                      pfVar76[2] = fVar126;
                                      pfVar76[3] = fVar142;
                                      pfVar76 = pfVar58 + lVar84;
                                      *pfVar76 = fVar147;
                                      pfVar76[1] = fVar151;
                                      pfVar76[2] = fVar127;
                                      pfVar76[3] = fVar143;
                                      pfVar58[4] = fVar132;
                                      pfVar58[5] = fVar136;
                                      pfVar58[6] = fVar112;
                                      pfVar58[7] = fVar128;
                                      pfVar76 = pfVar58 + lVar54 + 4;
                                      *pfVar76 = fVar133;
                                      pfVar76[1] = fVar137;
                                      pfVar76[2] = fVar113;
                                      pfVar76[3] = fVar129;
                                      pfVar76 = pfVar58 + lVar66 + 4;
                                      *pfVar76 = fVar134;
                                      pfVar76[1] = fVar138;
                                      pfVar76[2] = fVar114;
                                      pfVar76[3] = fVar130;
                                      pfVar76 = pfVar58 + lVar84 + 4;
                                      *pfVar76 = fVar135;
                                      pfVar76[1] = fVar139;
                                      pfVar76[2] = fVar115;
                                      pfVar76[3] = fVar131;
                                      pfVar58[8] = fVar116;
                                      pfVar58[9] = fVar120;
                                      pfVar58[10] = fVar94;
                                      pfVar58[0xb] = fVar108;
                                      pfVar76 = pfVar58 + lVar54 + 8;
                                      *pfVar76 = fVar117;
                                      pfVar76[1] = fVar121;
                                      pfVar76[2] = fVar103;
                                      pfVar76[3] = fVar109;
                                      pfVar76 = pfVar58 + lVar66 + 8;
                                      *pfVar76 = fVar118;
                                      pfVar76[1] = fVar122;
                                      pfVar76[2] = fVar104;
                                      pfVar76[3] = fVar110;
                                      pfVar76 = pfVar58 + lVar84 + 8;
                                      *pfVar76 = fVar119;
                                      pfVar76[1] = fVar123;
                                      pfVar76[2] = fVar107;
                                      pfVar76[3] = fVar111;
                                      pfVar58 = pfVar58 + 0xc;
                                    }
                                    else if (iVar2 == 4) {
                                      *pfVar58 = fVar144;
                                      pfVar58[1] = fVar145;
                                      pfVar58[2] = fVar146;
                                      pfVar58[3] = fVar147;
                                      pfVar58[4] = fVar148;
                                      pfVar58[5] = fVar149;
                                      pfVar58[6] = fVar150;
                                      pfVar58[7] = fVar151;
                                      pfVar58[8] = fVar124;
                                      pfVar58[9] = fVar125;
                                      pfVar58[10] = fVar126;
                                      pfVar58[0xb] = fVar127;
                                      pfVar58[0xc] = fVar140;
                                      pfVar58[0xd] = fVar141;
                                      pfVar58[0xe] = fVar142;
                                      pfVar58[0xf] = fVar143;
                                      pfVar58[0x10] = fVar132;
                                      pfVar58[0x11] = fVar133;
                                      pfVar58[0x12] = fVar134;
                                      pfVar58[0x13] = fVar135;
                                      pfVar58[0x14] = fVar136;
                                      pfVar58[0x15] = fVar137;
                                      pfVar58[0x16] = fVar138;
                                      pfVar58[0x17] = fVar139;
                                      pfVar58[0x18] = fVar112;
                                      pfVar58[0x19] = fVar113;
                                      pfVar58[0x1a] = fVar114;
                                      pfVar58[0x1b] = fVar115;
                                      pfVar58[0x1c] = fVar128;
                                      pfVar58[0x1d] = fVar129;
                                      pfVar58[0x1e] = fVar130;
                                      pfVar58[0x1f] = fVar131;
                                      pfVar58[0x20] = fVar116;
                                      pfVar58[0x21] = fVar117;
                                      pfVar58[0x22] = fVar118;
                                      pfVar58[0x23] = fVar119;
                                      pfVar58[0x24] = fVar120;
                                      pfVar58[0x25] = fVar121;
                                      pfVar58[0x26] = fVar122;
                                      pfVar58[0x27] = fVar123;
                                      pfVar58[0x28] = fVar94;
                                      pfVar58[0x29] = fVar103;
                                      pfVar58[0x2a] = fVar104;
                                      pfVar58[0x2b] = fVar107;
                                      pfVar58[0x2c] = fVar108;
                                      pfVar58[0x2d] = fVar109;
                                      pfVar58[0x2e] = fVar110;
                                      pfVar58[0x2f] = fVar111;
                                      pfVar58 = pfVar58 + 0x30;
                                    }
                                    pfVar69 = pfVar69 + 0x30;
                                    uVar71 = uVar62 + 0xc;
                                    iVar70 = uVar62 + 0x17;
                                    uVar62 = uVar71;
                                  } while (iVar70 < (int)uVar81);
                                }
                                iVar70 = uVar71 + 7;
                                while (iVar70 < (int)uVar81) {
                                  if (iVar68 == 0) {
                                    if (pfVar61 == (float *)0x0) {
                                      fVar108 = 0.0;
                                      fVar109 = 0.0;
                                      fVar110 = 0.0;
                                      fVar111 = 0.0;
                                      fVar136 = 0.0;
                                      fVar137 = 0.0;
                                      fVar138 = 0.0;
                                      fVar139 = 0.0;
                                      fVar120 = 0.0;
                                      fVar121 = 0.0;
                                      fVar122 = 0.0;
                                      fVar123 = 0.0;
                                      fVar112 = 0.0;
                                      fVar113 = 0.0;
                                      fVar114 = 0.0;
                                      fVar115 = 0.0;
                                      fVar124 = 0.0;
                                      fVar125 = 0.0;
                                      fVar126 = 0.0;
                                      fVar127 = 0.0;
                                      fVar116 = 0.0;
                                      fVar117 = 0.0;
                                      fVar118 = 0.0;
                                      fVar119 = 0.0;
                                      fVar132 = 0.0;
                                      fVar133 = 0.0;
                                      fVar134 = 0.0;
                                      fVar135 = 0.0;
                                      fVar128 = 0.0;
                                      fVar129 = 0.0;
                                      fVar130 = 0.0;
                                      fVar131 = 0.0;
                                    }
                                    else {
                                      fVar108 = *pfVar61;
                                      fVar109 = pfVar61[1];
                                      fVar110 = pfVar61[2];
                                      fVar111 = pfVar61[3];
                                      fVar112 = fVar108;
                                      fVar113 = fVar109;
                                      fVar114 = fVar110;
                                      fVar115 = fVar111;
                                      fVar116 = fVar108;
                                      fVar117 = fVar109;
                                      fVar118 = fVar110;
                                      fVar119 = fVar111;
                                      fVar120 = fVar108;
                                      fVar121 = fVar109;
                                      fVar122 = fVar110;
                                      fVar123 = fVar111;
                                      fVar124 = fVar108;
                                      fVar125 = fVar109;
                                      fVar126 = fVar110;
                                      fVar127 = fVar111;
                                      fVar128 = fVar108;
                                      fVar129 = fVar109;
                                      fVar130 = fVar110;
                                      fVar131 = fVar111;
                                      fVar132 = fVar108;
                                      fVar133 = fVar109;
                                      fVar134 = fVar110;
                                      fVar135 = fVar111;
                                      fVar136 = fVar108;
                                      fVar137 = fVar109;
                                      fVar138 = fVar110;
                                      fVar139 = fVar111;
                                    }
                                  }
                                  else {
                                    fVar108 = pfVar69[0x1c];
                                    fVar109 = pfVar69[0x1d];
                                    fVar110 = pfVar69[0x1e];
                                    fVar111 = pfVar69[0x1f];
                                    fVar112 = pfVar69[0x10];
                                    fVar113 = pfVar69[0x11];
                                    fVar114 = pfVar69[0x12];
                                    fVar115 = pfVar69[0x13];
                                    fVar116 = pfVar69[8];
                                    fVar117 = pfVar69[9];
                                    fVar118 = pfVar69[10];
                                    fVar119 = pfVar69[0xb];
                                    fVar120 = pfVar69[0x14];
                                    fVar121 = pfVar69[0x15];
                                    fVar122 = pfVar69[0x16];
                                    fVar123 = pfVar69[0x17];
                                    fVar124 = pfVar69[0xc];
                                    fVar125 = pfVar69[0xd];
                                    fVar126 = pfVar69[0xe];
                                    fVar127 = pfVar69[0xf];
                                    fVar128 = *pfVar69;
                                    fVar129 = pfVar69[1];
                                    fVar130 = pfVar69[2];
                                    fVar131 = pfVar69[3];
                                    fVar132 = pfVar69[4];
                                    fVar133 = pfVar69[5];
                                    fVar134 = pfVar69[6];
                                    fVar135 = pfVar69[7];
                                    fVar136 = pfVar69[0x18];
                                    fVar137 = pfVar69[0x19];
                                    fVar138 = pfVar69[0x1a];
                                    fVar139 = pfVar69[0x1b];
                                  }
                                  pfVar76 = pfVar65;
                                  iVar70 = iVar63;
                                  if (0 < iVar63) {
                                    do {
                                      fVar144 = *pfVar76;
                                      fVar145 = pfVar76[1];
                                      fVar146 = pfVar76[2];
                                      fVar147 = pfVar76[3];
                                      fVar140 = *pfVar90;
                                      fVar141 = pfVar90[1];
                                      fVar142 = pfVar90[2];
                                      fVar143 = pfVar90[3];
                                      fVar128 = fVar128 + fVar140 * fVar144;
                                      fVar129 = fVar129 + fVar140 * fVar145;
                                      fVar130 = fVar130 + fVar140 * fVar146;
                                      fVar131 = fVar131 + fVar140 * fVar147;
                                      fVar132 = fVar132 + fVar141 * fVar144;
                                      fVar133 = fVar133 + fVar141 * fVar145;
                                      fVar134 = fVar134 + fVar141 * fVar146;
                                      fVar135 = fVar135 + fVar141 * fVar147;
                                      fVar116 = fVar116 + fVar142 * fVar144;
                                      fVar117 = fVar117 + fVar142 * fVar145;
                                      fVar118 = fVar118 + fVar142 * fVar146;
                                      fVar119 = fVar119 + fVar142 * fVar147;
                                      fVar124 = fVar124 + fVar143 * fVar144;
                                      fVar125 = fVar125 + fVar143 * fVar145;
                                      fVar126 = fVar126 + fVar143 * fVar146;
                                      fVar127 = fVar127 + fVar143 * fVar147;
                                      fVar140 = pfVar90[4];
                                      fVar112 = fVar112 + fVar140 * fVar144;
                                      fVar113 = fVar113 + fVar140 * fVar145;
                                      fVar114 = fVar114 + fVar140 * fVar146;
                                      fVar115 = fVar115 + fVar140 * fVar147;
                                      fVar140 = pfVar90[5];
                                      fVar120 = fVar120 + fVar140 * fVar144;
                                      fVar121 = fVar121 + fVar140 * fVar145;
                                      fVar122 = fVar122 + fVar140 * fVar146;
                                      fVar123 = fVar123 + fVar140 * fVar147;
                                      fVar140 = pfVar90[6];
                                      fVar136 = fVar136 + fVar140 * fVar144;
                                      fVar137 = fVar137 + fVar140 * fVar145;
                                      fVar138 = fVar138 + fVar140 * fVar146;
                                      fVar139 = fVar139 + fVar140 * fVar147;
                                      fVar140 = pfVar90[7];
                                      fVar108 = fVar108 + fVar140 * fVar144;
                                      fVar109 = fVar109 + fVar140 * fVar145;
                                      fVar110 = fVar110 + fVar140 * fVar146;
                                      fVar111 = fVar111 + fVar140 * fVar147;
                                      pfVar90 = pfVar90 + 8;
                                      iVar70 = iVar70 + -1;
                                      pfVar76 = pfVar76 + 4;
                                    } while (iVar70 != 0);
                                  }
                                  if (iVar53 < iVar79) {
                                    *pfVar69 = fVar128;
                                    pfVar69[1] = fVar129;
                                    pfVar69[2] = fVar130;
                                    pfVar69[3] = fVar131;
                                    pfVar69[4] = fVar132;
                                    pfVar69[5] = fVar133;
                                    pfVar69[6] = fVar134;
                                    pfVar69[7] = fVar135;
                                    pfVar69[8] = fVar116;
                                    pfVar69[9] = fVar117;
                                    pfVar69[10] = fVar118;
                                    pfVar69[0xb] = fVar119;
                                    pfVar69[0xc] = fVar124;
                                    pfVar69[0xd] = fVar125;
                                    pfVar69[0xe] = fVar126;
                                    pfVar69[0xf] = fVar127;
                                    pfVar69[0x10] = fVar112;
                                    pfVar69[0x11] = fVar113;
                                    pfVar69[0x12] = fVar114;
                                    pfVar69[0x13] = fVar115;
                                    pfVar69[0x14] = fVar120;
                                    pfVar69[0x15] = fVar121;
                                    pfVar69[0x16] = fVar122;
                                    pfVar69[0x17] = fVar123;
                                    pfVar69[0x18] = fVar136;
                                    pfVar69[0x19] = fVar137;
                                    pfVar69[0x1a] = fVar138;
                                    pfVar69[0x1b] = fVar139;
                                    pfVar69[0x1c] = fVar108;
                                    pfVar69[0x1d] = fVar109;
                                    pfVar69[0x1e] = fVar110;
                                    pfVar69[0x1f] = fVar111;
                                  }
                                  else if (iVar2 == 1) {
                                    *pfVar58 = fVar128;
                                    pfVar58[1] = fVar132;
                                    pfVar58[2] = fVar116;
                                    pfVar58[3] = fVar124;
                                    pfVar76 = pfVar58 + lVar54;
                                    *pfVar76 = fVar129;
                                    pfVar76[1] = fVar133;
                                    pfVar76[2] = fVar117;
                                    pfVar76[3] = fVar125;
                                    pfVar76 = pfVar58 + lVar66;
                                    *pfVar76 = fVar130;
                                    pfVar76[1] = fVar134;
                                    pfVar76[2] = fVar118;
                                    pfVar76[3] = fVar126;
                                    pfVar76 = pfVar58 + lVar84;
                                    *pfVar76 = fVar131;
                                    pfVar76[1] = fVar135;
                                    pfVar76[2] = fVar119;
                                    pfVar76[3] = fVar127;
                                    pfVar58[4] = fVar112;
                                    pfVar58[5] = fVar120;
                                    pfVar58[6] = fVar136;
                                    pfVar58[7] = fVar108;
                                    pfVar76 = pfVar58 + lVar54 + 4;
                                    *pfVar76 = fVar113;
                                    pfVar76[1] = fVar121;
                                    pfVar76[2] = fVar137;
                                    pfVar76[3] = fVar109;
                                    pfVar76 = pfVar58 + lVar66 + 4;
                                    *pfVar76 = fVar114;
                                    pfVar76[1] = fVar122;
                                    pfVar76[2] = fVar138;
                                    pfVar76[3] = fVar110;
                                    pfVar76 = pfVar58 + lVar84 + 4;
                                    *pfVar76 = fVar115;
                                    pfVar76[1] = fVar123;
                                    pfVar76[2] = fVar139;
                                    pfVar76[3] = fVar111;
                                    pfVar58 = pfVar58 + 8;
                                  }
                                  else if (iVar2 == 4) {
                                    *pfVar58 = fVar128;
                                    pfVar58[1] = fVar129;
                                    pfVar58[2] = fVar130;
                                    pfVar58[3] = fVar131;
                                    pfVar58[4] = fVar132;
                                    pfVar58[5] = fVar133;
                                    pfVar58[6] = fVar134;
                                    pfVar58[7] = fVar135;
                                    pfVar58[8] = fVar116;
                                    pfVar58[9] = fVar117;
                                    pfVar58[10] = fVar118;
                                    pfVar58[0xb] = fVar119;
                                    pfVar58[0xc] = fVar124;
                                    pfVar58[0xd] = fVar125;
                                    pfVar58[0xe] = fVar126;
                                    pfVar58[0xf] = fVar127;
                                    pfVar58[0x10] = fVar112;
                                    pfVar58[0x11] = fVar113;
                                    pfVar58[0x12] = fVar114;
                                    pfVar58[0x13] = fVar115;
                                    pfVar58[0x14] = fVar120;
                                    pfVar58[0x15] = fVar121;
                                    pfVar58[0x16] = fVar122;
                                    pfVar58[0x17] = fVar123;
                                    pfVar58[0x18] = fVar136;
                                    pfVar58[0x19] = fVar137;
                                    pfVar58[0x1a] = fVar138;
                                    pfVar58[0x1b] = fVar139;
                                    pfVar58[0x1c] = fVar108;
                                    pfVar58[0x1d] = fVar109;
                                    pfVar58[0x1e] = fVar110;
                                    pfVar58[0x1f] = fVar111;
                                    pfVar58 = pfVar58 + 0x20;
                                  }
                                  pfVar69 = pfVar69 + 0x20;
                                  iVar70 = uVar71 + 0xf;
                                  uVar71 = uVar71 + 8;
                                }
                                uVar62 = uVar71 | 3;
                                while ((int)uVar62 < (int)uVar81) {
                                  if (iVar68 == 0) {
                                    if (pfVar61 == (float *)0x0) {
                                      fVar108 = 0.0;
                                      fVar109 = 0.0;
                                      fVar110 = 0.0;
                                      fVar111 = 0.0;
                                      fVar120 = 0.0;
                                      fVar121 = 0.0;
                                      fVar122 = 0.0;
                                      fVar123 = 0.0;
                                      fVar116 = 0.0;
                                      fVar117 = 0.0;
                                      fVar118 = 0.0;
                                      fVar119 = 0.0;
                                      fVar112 = 0.0;
                                      fVar113 = 0.0;
                                      fVar114 = 0.0;
                                      fVar115 = 0.0;
                                    }
                                    else {
                                      fVar108 = *pfVar61;
                                      fVar109 = pfVar61[1];
                                      fVar110 = pfVar61[2];
                                      fVar111 = pfVar61[3];
                                      fVar112 = fVar108;
                                      fVar113 = fVar109;
                                      fVar114 = fVar110;
                                      fVar115 = fVar111;
                                      fVar116 = fVar108;
                                      fVar117 = fVar109;
                                      fVar118 = fVar110;
                                      fVar119 = fVar111;
                                      fVar120 = fVar108;
                                      fVar121 = fVar109;
                                      fVar122 = fVar110;
                                      fVar123 = fVar111;
                                    }
                                  }
                                  else {
                                    fVar108 = pfVar69[0xc];
                                    fVar109 = pfVar69[0xd];
                                    fVar110 = pfVar69[0xe];
                                    fVar111 = pfVar69[0xf];
                                    fVar112 = *pfVar69;
                                    fVar113 = pfVar69[1];
                                    fVar114 = pfVar69[2];
                                    fVar115 = pfVar69[3];
                                    fVar116 = pfVar69[4];
                                    fVar117 = pfVar69[5];
                                    fVar118 = pfVar69[6];
                                    fVar119 = pfVar69[7];
                                    fVar120 = pfVar69[8];
                                    fVar121 = pfVar69[9];
                                    fVar122 = pfVar69[10];
                                    fVar123 = pfVar69[0xb];
                                  }
                                  if (0 < iVar63) {
                                    lVar72 = 0;
                                    iVar70 = iVar63;
                                    do {
                                      pfVar76 = (float *)((long)pfVar65 + lVar72);
                                      fVar128 = *pfVar76;
                                      fVar129 = pfVar76[1];
                                      fVar130 = pfVar76[2];
                                      fVar131 = pfVar76[3];
                                      fVar124 = *(float *)((long)pfVar90 + lVar72);
                                      fVar125 = *(float *)((long)pfVar90 + lVar72 + 4);
                                      fVar126 = *(float *)((long)pfVar90 + lVar72 + 8);
                                      fVar127 = *(float *)((long)pfVar90 + lVar72 + 0xc);
                                      fVar112 = fVar112 + fVar124 * fVar128;
                                      fVar113 = fVar113 + fVar124 * fVar129;
                                      fVar114 = fVar114 + fVar124 * fVar130;
                                      fVar115 = fVar115 + fVar124 * fVar131;
                                      fVar116 = fVar116 + fVar125 * fVar128;
                                      fVar117 = fVar117 + fVar125 * fVar129;
                                      fVar118 = fVar118 + fVar125 * fVar130;
                                      fVar119 = fVar119 + fVar125 * fVar131;
                                      fVar120 = fVar120 + fVar126 * fVar128;
                                      fVar121 = fVar121 + fVar126 * fVar129;
                                      fVar122 = fVar122 + fVar126 * fVar130;
                                      fVar123 = fVar123 + fVar126 * fVar131;
                                      fVar108 = fVar108 + fVar127 * fVar128;
                                      fVar109 = fVar109 + fVar127 * fVar129;
                                      fVar110 = fVar110 + fVar127 * fVar130;
                                      fVar111 = fVar111 + fVar127 * fVar131;
                                      lVar72 = lVar72 + 0x10;
                                      iVar70 = iVar70 + -1;
                                    } while (iVar70 != 0);
                                    pfVar90 = (float *)((long)pfVar90 + lVar72);
                                  }
                                  if (iVar53 < iVar79) {
                                    *pfVar69 = fVar112;
                                    pfVar69[1] = fVar113;
                                    pfVar69[2] = fVar114;
                                    pfVar69[3] = fVar115;
                                    pfVar69[4] = fVar116;
                                    pfVar69[5] = fVar117;
                                    pfVar69[6] = fVar118;
                                    pfVar69[7] = fVar119;
                                    pfVar69[8] = fVar120;
                                    pfVar69[9] = fVar121;
                                    pfVar69[10] = fVar122;
                                    pfVar69[0xb] = fVar123;
                                    pfVar69[0xc] = fVar108;
                                    pfVar69[0xd] = fVar109;
                                    pfVar69[0xe] = fVar110;
                                    pfVar69[0xf] = fVar111;
                                  }
                                  else if (iVar2 == 1) {
                                    *pfVar58 = fVar112;
                                    pfVar58[1] = fVar116;
                                    pfVar58[2] = fVar120;
                                    pfVar58[3] = fVar108;
                                    pfVar76 = pfVar58 + lVar54;
                                    *pfVar76 = fVar113;
                                    pfVar76[1] = fVar117;
                                    pfVar76[2] = fVar121;
                                    pfVar76[3] = fVar109;
                                    pfVar76 = pfVar58 + lVar66;
                                    *pfVar76 = fVar114;
                                    pfVar76[1] = fVar118;
                                    pfVar76[2] = fVar122;
                                    pfVar76[3] = fVar110;
                                    pfVar76 = pfVar58 + lVar84;
                                    *pfVar76 = fVar115;
                                    pfVar76[1] = fVar119;
                                    pfVar76[2] = fVar123;
                                    pfVar76[3] = fVar111;
                                    pfVar58 = pfVar58 + 4;
                                  }
                                  else if (iVar2 == 4) {
                                    *pfVar58 = fVar112;
                                    pfVar58[1] = fVar113;
                                    pfVar58[2] = fVar114;
                                    pfVar58[3] = fVar115;
                                    pfVar58[4] = fVar116;
                                    pfVar58[5] = fVar117;
                                    pfVar58[6] = fVar118;
                                    pfVar58[7] = fVar119;
                                    pfVar58[8] = fVar120;
                                    pfVar58[9] = fVar121;
                                    pfVar58[10] = fVar122;
                                    pfVar58[0xb] = fVar123;
                                    pfVar58[0xc] = fVar108;
                                    pfVar58[0xd] = fVar109;
                                    pfVar58[0xe] = fVar110;
                                    pfVar58[0xf] = fVar111;
                                    pfVar58 = pfVar58 + 0x10;
                                  }
                                  pfVar69 = pfVar69 + 0x10;
                                  uVar62 = uVar71 + 7;
                                  uVar71 = uVar71 + 4;
                                }
                                uVar62 = uVar71 | 1;
                                while ((int)uVar62 < (int)uVar81) {
                                  if (iVar68 == 0) {
                                    if (pfVar61 == (float *)0x0) {
                                      fVar112 = 0.0;
                                      fVar113 = 0.0;
                                      fVar114 = 0.0;
                                      fVar115 = 0.0;
                                      fVar108 = 0.0;
                                      fVar109 = 0.0;
                                      fVar110 = 0.0;
                                      fVar111 = 0.0;
                                    }
                                    else {
                                      fVar108 = *pfVar61;
                                      fVar109 = pfVar61[1];
                                      fVar110 = pfVar61[2];
                                      fVar111 = pfVar61[3];
                                      fVar112 = fVar108;
                                      fVar113 = fVar109;
                                      fVar114 = fVar110;
                                      fVar115 = fVar111;
                                    }
                                  }
                                  else {
                                    fVar108 = *pfVar69;
                                    fVar109 = pfVar69[1];
                                    fVar110 = pfVar69[2];
                                    fVar111 = pfVar69[3];
                                    fVar112 = pfVar69[4];
                                    fVar113 = pfVar69[5];
                                    fVar114 = pfVar69[6];
                                    fVar115 = pfVar69[7];
                                  }
                                  if (0 < iVar63) {
                                    lVar72 = 0;
                                    iVar70 = iVar63;
                                    do {
                                      pfVar76 = (float *)((long)pfVar65 + lVar72 * 2);
                                      fVar116 = *(float *)((long)pfVar90 + lVar72);
                                      fVar117 = *(float *)((long)pfVar90 + lVar72 + 4);
                                      fVar108 = fVar108 + fVar116 * *pfVar76;
                                      fVar109 = fVar109 + fVar116 * pfVar76[1];
                                      fVar110 = fVar110 + fVar116 * pfVar76[2];
                                      fVar111 = fVar111 + fVar116 * pfVar76[3];
                                      fVar112 = fVar112 + fVar117 * *pfVar76;
                                      fVar113 = fVar113 + fVar117 * pfVar76[1];
                                      fVar114 = fVar114 + fVar117 * pfVar76[2];
                                      fVar115 = fVar115 + fVar117 * pfVar76[3];
                                      lVar72 = lVar72 + 8;
                                      iVar70 = iVar70 + -1;
                                    } while (iVar70 != 0);
                                    pfVar90 = (float *)((long)pfVar90 + lVar72);
                                  }
                                  if (iVar53 < iVar79) {
                                    *pfVar69 = fVar108;
                                    pfVar69[1] = fVar109;
                                    pfVar69[2] = fVar110;
                                    pfVar69[3] = fVar111;
                                    pfVar69[4] = fVar112;
                                    pfVar69[5] = fVar113;
                                    pfVar69[6] = fVar114;
                                    pfVar69[7] = fVar115;
                                  }
                                  else if (iVar2 == 1) {
                                    *pfVar58 = fVar108;
                                    pfVar58[lVar54] = fVar109;
                                    pfVar58[lVar66] = fVar110;
                                    pfVar58[local_e8] = fVar111;
                                    pfVar58[1] = fVar112;
                                    pfVar58[(long)((local_88 << 0x20) + 0x100000000) >> 0x20] =
                                         fVar113;
                                    pfVar58[local_40] = fVar114;
                                    pfVar58[local_48] = fVar115;
                                    pfVar58 = pfVar58 + 2;
                                  }
                                  else if (iVar2 == 4) {
                                    *pfVar58 = fVar108;
                                    pfVar58[1] = fVar109;
                                    pfVar58[2] = fVar110;
                                    pfVar58[3] = fVar111;
                                    pfVar58[4] = fVar112;
                                    pfVar58[5] = fVar113;
                                    pfVar58[6] = fVar114;
                                    pfVar58[7] = fVar115;
                                    pfVar58 = pfVar58 + 8;
                                  }
                                  pfVar69 = pfVar69 + 8;
                                  uVar62 = uVar71 + 3;
                                  uVar71 = uVar71 + 2;
                                }
                                if ((int)uVar71 < (int)uVar81) {
                                  do {
                                    if (iVar68 == 0) {
                                      if (pfVar61 == (float *)0x0) {
                                        fVar108 = 0.0;
                                        fVar109 = 0.0;
                                        fVar110 = 0.0;
                                        fVar111 = 0.0;
                                      }
                                      else {
                                        fVar108 = *pfVar61;
                                        fVar109 = pfVar61[1];
                                        fVar110 = pfVar61[2];
                                        fVar111 = pfVar61[3];
                                      }
                                    }
                                    else {
                                      fVar108 = *pfVar69;
                                      fVar109 = pfVar69[1];
                                      fVar110 = pfVar69[2];
                                      fVar111 = pfVar69[3];
                                    }
                                    if (0 < iVar63) {
                                      lVar72 = 0;
                                      iVar70 = iVar63;
                                      do {
                                        pfVar76 = pfVar65 + lVar72;
                                        fVar112 = *(float *)((long)pfVar90 + lVar72);
                                        fVar108 = fVar108 + fVar112 * *pfVar76;
                                        fVar109 = fVar109 + fVar112 * pfVar76[1];
                                        fVar110 = fVar110 + fVar112 * pfVar76[2];
                                        fVar111 = fVar111 + fVar112 * pfVar76[3];
                                        lVar72 = lVar72 + 4;
                                        iVar70 = iVar70 + -1;
                                      } while (iVar70 != 0);
                                      pfVar90 = (float *)((long)pfVar90 + lVar72);
                                    }
                                    if (iVar53 < iVar79) {
                                      *pfVar69 = fVar108;
                                      pfVar69[1] = fVar109;
                                      pfVar69[2] = fVar110;
                                      pfVar69[3] = fVar111;
                                    }
                                    else if (iVar2 == 1) {
                                      *pfVar58 = fVar108;
                                      pfVar58[lVar54] = fVar109;
                                      pfVar58[lVar66] = fVar110;
                                      pfVar58[lVar84] = fVar111;
                                      pfVar58 = pfVar58 + 1;
                                    }
                                    else if (iVar2 == 4) {
                                      *pfVar58 = fVar108;
                                      pfVar58[1] = fVar109;
                                      pfVar58[2] = fVar110;
                                      pfVar58[3] = fVar111;
                                      pfVar58 = pfVar58 + 4;
                                    }
                                    pfVar69 = pfVar69 + 4;
                                    uVar71 = uVar71 + 1;
                                  } while (uVar71 != uVar81);
                                }
                                pfVar65 = pfVar65 + iVar63 * 4;
                                uVar73 = local_68 + 4;
                                pfVar58 = pfVar61;
                              } while (local_68 + 7 < uVar83);
                            }
                            if ((int)((uint)uVar73 | 1) < (int)uVar59) {
                              lVar84 = (long)iVar56;
                              if (iVar52 < iVar64) {
                                iVar64 = iVar52;
                              }
                              local_e8 = (long)(iVar63 * 2) * 4;
                              uVar60 = uVar73 & 0xffffffff;
                              do {
                                pfVar58 = (float *)((long)(this->super_Convolution).bias_data.data +
                                                   uVar60 * 4 + local_150 * 4);
                                if (pfVar61 != (float *)0x0) {
                                  pfVar61 = pfVar58;
                                }
                                uVar71 = 0;
                                pfVar90 = (float *)((long)top_blob->data +
                                                   local_60 * 4 + (uVar60 + local_150) * lVar84 * 4)
                                ;
                                pfVar76 = pfVar57;
                                if (0xb < (int)uVar81) {
                                  uVar62 = 0;
                                  do {
                                    if (iVar68 == 0) {
                                      if (pfVar61 == (float *)0x0) {
                                        fVar128 = 0.0;
                                        fVar129 = 0.0;
                                        fVar130 = 0.0;
                                        fVar131 = 0.0;
                                        fVar108 = 0.0;
                                        fVar113 = 0.0;
                                        fVar114 = 0.0;
                                        fVar115 = 0.0;
                                        fVar116 = 0.0;
                                        fVar117 = 0.0;
                                        fVar118 = 0.0;
                                        fVar119 = 0.0;
                                        fVar109 = 0.0;
                                        fVar110 = 0.0;
                                        fVar111 = 0.0;
                                        fVar112 = 0.0;
                                        fVar124 = 0.0;
                                        fVar125 = 0.0;
                                        fVar126 = 0.0;
                                        fVar127 = 0.0;
                                        fVar120 = 0.0;
                                        fVar121 = 0.0;
                                        fVar122 = 0.0;
                                        fVar123 = 0.0;
                                      }
                                      else {
                                        fVar108 = *pfVar61;
                                        fVar109 = pfVar61[1];
                                        fVar110 = fVar109;
                                        fVar111 = fVar109;
                                        fVar112 = fVar109;
                                        fVar113 = fVar108;
                                        fVar114 = fVar108;
                                        fVar115 = fVar108;
                                        fVar116 = fVar108;
                                        fVar117 = fVar108;
                                        fVar118 = fVar108;
                                        fVar119 = fVar108;
                                        fVar120 = fVar109;
                                        fVar121 = fVar109;
                                        fVar122 = fVar109;
                                        fVar123 = fVar109;
                                        fVar124 = fVar109;
                                        fVar125 = fVar109;
                                        fVar126 = fVar109;
                                        fVar127 = fVar109;
                                        fVar128 = fVar108;
                                        fVar129 = fVar108;
                                        fVar130 = fVar108;
                                        fVar131 = fVar108;
                                      }
                                    }
                                    else {
                                      fVar109 = pfVar69[1];
                                      fVar108 = pfVar69[8];
                                      fVar110 = pfVar69[3];
                                      fVar111 = pfVar69[5];
                                      fVar112 = pfVar69[7];
                                      fVar113 = pfVar69[10];
                                      fVar114 = pfVar69[0xc];
                                      fVar115 = pfVar69[0xe];
                                      fVar116 = pfVar69[0x10];
                                      fVar117 = pfVar69[0x12];
                                      fVar118 = pfVar69[0x14];
                                      fVar119 = pfVar69[0x16];
                                      fVar120 = pfVar69[0x11];
                                      fVar121 = pfVar69[0x13];
                                      fVar122 = pfVar69[0x15];
                                      fVar123 = pfVar69[0x17];
                                      fVar124 = pfVar69[9];
                                      fVar125 = pfVar69[0xb];
                                      fVar126 = pfVar69[0xd];
                                      fVar127 = pfVar69[0xf];
                                      fVar128 = *pfVar69;
                                      fVar129 = pfVar69[2];
                                      fVar130 = pfVar69[4];
                                      fVar131 = pfVar69[6];
                                    }
                                    if (0 < iVar63) {
                                      lVar54 = 0;
                                      do {
                                        fVar132 = pfVar65[lVar54 * 2];
                                        fVar133 = pfVar65[lVar54 * 2 + 1];
                                        fVar128 = fVar128 + fVar132 * *pfVar76;
                                        fVar129 = fVar129 + fVar132 * pfVar76[1];
                                        fVar130 = fVar130 + fVar132 * pfVar76[2];
                                        fVar131 = fVar131 + fVar132 * pfVar76[3];
                                        fVar108 = fVar108 + fVar132 * pfVar76[4];
                                        fVar113 = fVar113 + fVar132 * pfVar76[5];
                                        fVar114 = fVar114 + fVar132 * pfVar76[6];
                                        fVar115 = fVar115 + fVar132 * pfVar76[7];
                                        fVar116 = fVar116 + fVar132 * pfVar76[8];
                                        fVar117 = fVar117 + fVar132 * pfVar76[9];
                                        fVar118 = fVar118 + fVar132 * pfVar76[10];
                                        fVar119 = fVar119 + fVar132 * pfVar76[0xb];
                                        fVar109 = fVar109 + *pfVar76 * fVar133;
                                        fVar110 = fVar110 + pfVar76[1] * fVar133;
                                        fVar111 = fVar111 + pfVar76[2] * fVar133;
                                        fVar112 = fVar112 + pfVar76[3] * fVar133;
                                        fVar124 = fVar124 + pfVar76[4] * fVar133;
                                        fVar125 = fVar125 + pfVar76[5] * fVar133;
                                        fVar126 = fVar126 + pfVar76[6] * fVar133;
                                        fVar127 = fVar127 + pfVar76[7] * fVar133;
                                        fVar120 = fVar120 + fVar133 * pfVar76[8];
                                        fVar121 = fVar121 + fVar133 * pfVar76[9];
                                        fVar122 = fVar122 + fVar133 * pfVar76[10];
                                        fVar123 = fVar123 + fVar133 * pfVar76[0xb];
                                        pfVar76 = pfVar76 + 0xc;
                                        lVar54 = lVar54 + 1;
                                      } while (iVar64 != (int)lVar54);
                                    }
                                    if (iVar53 < iVar79) {
                                      *pfVar69 = fVar128;
                                      pfVar69[1] = fVar109;
                                      pfVar69[2] = fVar129;
                                      pfVar69[3] = fVar110;
                                      pfVar69[4] = fVar130;
                                      pfVar69[5] = fVar111;
                                      pfVar69[6] = fVar131;
                                      pfVar69[7] = fVar112;
                                      pfVar69[8] = fVar108;
                                      pfVar69[9] = fVar124;
                                      pfVar69[10] = fVar113;
                                      pfVar69[0xb] = fVar125;
                                      pfVar69[0xc] = fVar114;
                                      pfVar69[0xd] = fVar126;
                                      pfVar69[0xe] = fVar115;
                                      pfVar69[0xf] = fVar127;
                                      pfVar69[0x10] = fVar116;
                                      pfVar69[0x11] = fVar120;
                                      pfVar69[0x12] = fVar117;
                                      pfVar69[0x13] = fVar121;
                                      pfVar69[0x14] = fVar118;
                                      pfVar69[0x15] = fVar122;
                                      pfVar69[0x16] = fVar119;
                                      pfVar69[0x17] = fVar123;
                                    }
                                    else {
                                      *pfVar90 = fVar128;
                                      pfVar90[1] = fVar129;
                                      pfVar90[2] = fVar130;
                                      pfVar90[3] = fVar131;
                                      pfVar90[4] = fVar108;
                                      pfVar90[5] = fVar113;
                                      pfVar90[6] = fVar114;
                                      pfVar90[7] = fVar115;
                                      pfVar90[8] = fVar116;
                                      pfVar90[9] = fVar117;
                                      pfVar90[10] = fVar118;
                                      pfVar90[0xb] = fVar119;
                                      pfVar91 = pfVar90 + lVar84;
                                      *pfVar91 = fVar109;
                                      pfVar91[1] = fVar110;
                                      pfVar91[2] = fVar111;
                                      pfVar91[3] = fVar112;
                                      pfVar91 = pfVar90 + lVar84 + 4;
                                      *pfVar91 = fVar124;
                                      pfVar91[1] = fVar125;
                                      pfVar91[2] = fVar126;
                                      pfVar91[3] = fVar127;
                                      pfVar91 = pfVar90 + lVar84 + 8;
                                      *pfVar91 = fVar120;
                                      pfVar91[1] = fVar121;
                                      pfVar91[2] = fVar122;
                                      pfVar91[3] = fVar123;
                                      pfVar90 = pfVar90 + 0xc;
                                    }
                                    pfVar69 = pfVar69 + 0x18;
                                    uVar71 = uVar62 + 0xc;
                                    iVar52 = uVar62 + 0x17;
                                    uVar62 = uVar71;
                                  } while (iVar52 < (int)uVar81);
                                }
                                iVar52 = uVar71 + 7;
                                while (iVar52 < (int)uVar81) {
                                  if (iVar68 == 0) {
                                    if (pfVar61 == (float *)0x0) {
                                      fVar120 = 0.0;
                                      fVar121 = 0.0;
                                      fVar122 = 0.0;
                                      fVar123 = 0.0;
                                      fVar108 = 0.0;
                                      fVar113 = 0.0;
                                      fVar114 = 0.0;
                                      fVar115 = 0.0;
                                      fVar109 = 0.0;
                                      fVar110 = 0.0;
                                      fVar111 = 0.0;
                                      fVar112 = 0.0;
                                      fVar116 = 0.0;
                                      fVar117 = 0.0;
                                      fVar118 = 0.0;
                                      fVar119 = 0.0;
                                    }
                                    else {
                                      fVar108 = *pfVar61;
                                      fVar109 = pfVar61[1];
                                      fVar110 = fVar109;
                                      fVar111 = fVar109;
                                      fVar112 = fVar109;
                                      fVar113 = fVar108;
                                      fVar114 = fVar108;
                                      fVar115 = fVar108;
                                      fVar116 = fVar109;
                                      fVar117 = fVar109;
                                      fVar118 = fVar109;
                                      fVar119 = fVar109;
                                      fVar120 = fVar108;
                                      fVar121 = fVar108;
                                      fVar122 = fVar108;
                                      fVar123 = fVar108;
                                    }
                                  }
                                  else {
                                    fVar109 = pfVar69[1];
                                    fVar108 = pfVar69[8];
                                    fVar110 = pfVar69[3];
                                    fVar111 = pfVar69[5];
                                    fVar112 = pfVar69[7];
                                    fVar113 = pfVar69[10];
                                    fVar114 = pfVar69[0xc];
                                    fVar115 = pfVar69[0xe];
                                    fVar116 = pfVar69[9];
                                    fVar117 = pfVar69[0xb];
                                    fVar118 = pfVar69[0xd];
                                    fVar119 = pfVar69[0xf];
                                    fVar120 = *pfVar69;
                                    fVar121 = pfVar69[2];
                                    fVar122 = pfVar69[4];
                                    fVar123 = pfVar69[6];
                                  }
                                  if (0 < iVar63) {
                                    lVar54 = 0;
                                    do {
                                      fVar124 = pfVar65[lVar54 * 2];
                                      fVar125 = pfVar65[lVar54 * 2 + 1];
                                      fVar120 = fVar120 + fVar124 * *pfVar76;
                                      fVar121 = fVar121 + fVar124 * pfVar76[1];
                                      fVar122 = fVar122 + fVar124 * pfVar76[2];
                                      fVar123 = fVar123 + fVar124 * pfVar76[3];
                                      fVar108 = fVar108 + fVar124 * pfVar76[4];
                                      fVar113 = fVar113 + fVar124 * pfVar76[5];
                                      fVar114 = fVar114 + fVar124 * pfVar76[6];
                                      fVar115 = fVar115 + fVar124 * pfVar76[7];
                                      fVar109 = fVar109 + *pfVar76 * fVar125;
                                      fVar110 = fVar110 + pfVar76[1] * fVar125;
                                      fVar111 = fVar111 + pfVar76[2] * fVar125;
                                      fVar112 = fVar112 + pfVar76[3] * fVar125;
                                      fVar116 = fVar116 + fVar125 * pfVar76[4];
                                      fVar117 = fVar117 + fVar125 * pfVar76[5];
                                      fVar118 = fVar118 + fVar125 * pfVar76[6];
                                      fVar119 = fVar119 + fVar125 * pfVar76[7];
                                      pfVar76 = pfVar76 + 8;
                                      lVar54 = lVar54 + 1;
                                    } while (iVar64 != (int)lVar54);
                                  }
                                  if (iVar53 < iVar79) {
                                    *pfVar69 = fVar120;
                                    pfVar69[1] = fVar109;
                                    pfVar69[2] = fVar121;
                                    pfVar69[3] = fVar110;
                                    pfVar69[4] = fVar122;
                                    pfVar69[5] = fVar111;
                                    pfVar69[6] = fVar123;
                                    pfVar69[7] = fVar112;
                                    pfVar69[8] = fVar108;
                                    pfVar69[9] = fVar116;
                                    pfVar69[10] = fVar113;
                                    pfVar69[0xb] = fVar117;
                                    pfVar69[0xc] = fVar114;
                                    pfVar69[0xd] = fVar118;
                                    pfVar69[0xe] = fVar115;
                                    pfVar69[0xf] = fVar119;
                                  }
                                  else {
                                    *pfVar90 = fVar120;
                                    pfVar90[1] = fVar121;
                                    pfVar90[2] = fVar122;
                                    pfVar90[3] = fVar123;
                                    pfVar90[4] = fVar108;
                                    pfVar90[5] = fVar113;
                                    pfVar90[6] = fVar114;
                                    pfVar90[7] = fVar115;
                                    pfVar91 = pfVar90 + lVar84;
                                    *pfVar91 = fVar109;
                                    pfVar91[1] = fVar110;
                                    pfVar91[2] = fVar111;
                                    pfVar91[3] = fVar112;
                                    pfVar91 = pfVar90 + lVar84 + 4;
                                    *pfVar91 = fVar116;
                                    pfVar91[1] = fVar117;
                                    pfVar91[2] = fVar118;
                                    pfVar91[3] = fVar119;
                                    pfVar90 = pfVar90 + 8;
                                  }
                                  pfVar69 = pfVar69 + 0x10;
                                  iVar52 = uVar71 + 0xf;
                                  uVar71 = uVar71 + 8;
                                }
                                uVar62 = uVar71 | 3;
                                while ((int)uVar62 < (int)uVar81) {
                                  if (iVar68 == 0) {
                                    if (pfVar61 == (float *)0x0) {
                                      fVar108 = 0.0;
                                      fVar113 = 0.0;
                                      fVar114 = 0.0;
                                      fVar115 = 0.0;
                                      fVar109 = 0.0;
                                      fVar110 = 0.0;
                                      fVar111 = 0.0;
                                      fVar112 = 0.0;
                                    }
                                    else {
                                      fVar108 = *pfVar61;
                                      fVar109 = pfVar61[1];
                                      fVar110 = fVar109;
                                      fVar111 = fVar109;
                                      fVar112 = fVar109;
                                      fVar113 = fVar108;
                                      fVar114 = fVar108;
                                      fVar115 = fVar108;
                                    }
                                  }
                                  else {
                                    fVar108 = *pfVar69;
                                    fVar109 = pfVar69[1];
                                    fVar110 = pfVar69[3];
                                    fVar111 = pfVar69[5];
                                    fVar112 = pfVar69[7];
                                    fVar113 = pfVar69[2];
                                    fVar114 = pfVar69[4];
                                    fVar115 = pfVar69[6];
                                  }
                                  if (0 < iVar63) {
                                    lVar54 = 0;
                                    do {
                                      fVar116 = pfVar65[lVar54 * 2];
                                      fVar117 = pfVar65[lVar54 * 2 + 1];
                                      fVar108 = fVar108 + fVar116 * *pfVar76;
                                      fVar113 = fVar113 + fVar116 * pfVar76[1];
                                      fVar114 = fVar114 + fVar116 * pfVar76[2];
                                      fVar115 = fVar115 + fVar116 * pfVar76[3];
                                      fVar109 = fVar109 + fVar117 * *pfVar76;
                                      fVar110 = fVar110 + fVar117 * pfVar76[1];
                                      fVar111 = fVar111 + fVar117 * pfVar76[2];
                                      fVar112 = fVar112 + fVar117 * pfVar76[3];
                                      pfVar76 = pfVar76 + 4;
                                      lVar54 = lVar54 + 1;
                                    } while (iVar64 != (int)lVar54);
                                  }
                                  if (iVar53 < iVar79) {
                                    *pfVar69 = fVar108;
                                    pfVar69[1] = fVar109;
                                    pfVar69[2] = fVar113;
                                    pfVar69[3] = fVar110;
                                    pfVar69[4] = fVar114;
                                    pfVar69[5] = fVar111;
                                    pfVar69[6] = fVar115;
                                    pfVar69[7] = fVar112;
                                  }
                                  else {
                                    *pfVar90 = fVar108;
                                    pfVar90[1] = fVar113;
                                    pfVar90[2] = fVar114;
                                    pfVar90[3] = fVar115;
                                    pfVar91 = pfVar90 + lVar84;
                                    *pfVar91 = fVar109;
                                    pfVar91[1] = fVar110;
                                    pfVar91[2] = fVar111;
                                    pfVar91[3] = fVar112;
                                    pfVar90 = pfVar90 + 4;
                                  }
                                  pfVar69 = pfVar69 + 8;
                                  uVar62 = uVar71 + 7;
                                  uVar71 = uVar71 + 4;
                                }
                                uVar62 = uVar71 | 1;
                                while ((int)uVar62 < (int)uVar81) {
                                  if (iVar68 == 0) {
                                    if (pfVar61 == (float *)0x0) {
                                      fVar108 = 0.0;
                                      fVar109 = 0.0;
                                      fVar110 = 0.0;
                                      fVar111 = 0.0;
                                    }
                                    else {
                                      fVar108 = pfVar61[2];
                                      fVar109 = pfVar61[3];
                                      fVar110 = fVar108;
                                      fVar111 = fVar109;
                                    }
                                  }
                                  else {
                                    fVar108 = *pfVar69;
                                    fVar109 = pfVar69[1];
                                    fVar110 = pfVar69[2];
                                    fVar111 = pfVar69[3];
                                  }
                                  if (0 < iVar63) {
                                    lVar54 = 0;
                                    lVar66 = 0;
                                    do {
                                      fVar112 = (float)*(undefined8 *)(pfVar65 + lVar66 * 2);
                                      fVar113 = (float)((ulong)*(undefined8 *)(pfVar65 + lVar66 * 2)
                                                       >> 0x20);
                                      fVar114 = (float)*(undefined8 *)(pfVar76 + lVar66 * 2);
                                      fVar115 = (float)((ulong)*(undefined8 *)(pfVar76 + lVar66 * 2)
                                                       >> 0x20);
                                      fVar108 = fVar108 + fVar114 * fVar112;
                                      fVar109 = fVar109 + fVar114 * fVar113;
                                      fVar110 = fVar110 + fVar115 * fVar112;
                                      fVar111 = fVar111 + fVar115 * fVar113;
                                      lVar66 = lVar66 + 1;
                                      lVar54 = lVar54 + -8;
                                    } while (iVar64 != (int)lVar66);
                                    pfVar76 = (float *)((long)pfVar76 - lVar54);
                                  }
                                  if (iVar53 < iVar79) {
                                    *pfVar69 = fVar108;
                                    pfVar69[1] = fVar109;
                                    pfVar69[2] = fVar110;
                                    pfVar69[3] = fVar111;
                                  }
                                  else {
                                    *(ulong *)pfVar90 = CONCAT44(fVar110,fVar108);
                                    pfVar90[lVar84] = fVar109;
                                    pfVar90[(long)((local_88 << 0x20) + 0x100000000) >> 0x20] =
                                         fVar111;
                                    pfVar90 = pfVar90 + 2;
                                  }
                                  pfVar69 = pfVar69 + 4;
                                  uVar62 = uVar71 + 3;
                                  uVar71 = uVar71 + 2;
                                }
                                if ((int)uVar71 < (int)uVar81) {
                                  do {
                                    fVar108 = 0.0;
                                    fVar109 = 0.0;
                                    if (pfVar61 != (float *)0x0 || iVar68 != 0) {
                                      pfVar91 = pfVar58;
                                      if (iVar68 != 0) {
                                        pfVar91 = pfVar69;
                                      }
                                      fVar108 = *pfVar91;
                                      fVar109 = pfVar91[1];
                                    }
                                    if (0 < iVar63) {
                                      lVar54 = 0;
                                      do {
                                        fVar108 = fVar108 + *pfVar76 *
                                                            (float)*(undefined8 *)
                                                                    (pfVar65 + lVar54 * 2);
                                        fVar109 = fVar109 + *pfVar76 *
                                                            (float)((ulong)*(undefined8 *)
                                                                            (pfVar65 + lVar54 * 2)
                                                                   >> 0x20);
                                        pfVar76 = pfVar76 + 1;
                                        lVar54 = lVar54 + 1;
                                      } while (iVar64 != (int)lVar54);
                                    }
                                    if (iVar53 < iVar79) {
                                      *pfVar69 = fVar108;
                                      pfVar69[1] = fVar109;
                                    }
                                    else {
                                      *pfVar90 = fVar108;
                                      pfVar90[lVar84] = fVar109;
                                      pfVar90 = pfVar90 + 1;
                                    }
                                    pfVar69 = pfVar69 + 2;
                                    uVar71 = uVar71 + 1;
                                  } while (uVar71 != uVar81);
                                }
                                pfVar65 = pfVar65 + iVar63 * 2;
                                uVar73 = uVar60 + 2;
                                lVar54 = uVar60 + 3;
                                uVar60 = uVar73;
                              } while (lVar54 < (long)local_80);
                            }
                            if ((int)uVar73 < (int)uVar59) {
                              uVar73 = uVar73 & 0xffffffff;
                              do {
                                pfVar58 = (float *)((long)(this->super_Convolution).bias_data.data +
                                                   uVar73 * 4 + local_150 * 4);
                                if (pfVar61 == (float *)0x0) {
                                  pfVar58 = pfVar61;
                                }
                                uVar71 = 0;
                                pfVar61 = (float *)((long)top_blob->data +
                                                   local_60 * 4 +
                                                   (uVar73 + local_150) * (long)iVar56 * 4);
                                pfVar90 = pfVar57;
                                if (0xb < (int)uVar81) {
                                  uVar62 = 0;
                                  do {
                                    if (iVar68 == 0) {
                                      if (pfVar58 == (float *)0x0) {
                                        fVar116 = 0.0;
                                        fVar117 = 0.0;
                                        fVar118 = 0.0;
                                        fVar119 = 0.0;
                                        fVar108 = 0.0;
                                        fVar109 = 0.0;
                                        fVar110 = 0.0;
                                        fVar111 = 0.0;
                                        fVar112 = 0.0;
                                        fVar113 = 0.0;
                                        fVar114 = 0.0;
                                        fVar115 = 0.0;
                                      }
                                      else {
                                        fVar108 = *pfVar58;
                                        fVar109 = fVar108;
                                        fVar110 = fVar108;
                                        fVar111 = fVar108;
                                        fVar112 = fVar108;
                                        fVar113 = fVar108;
                                        fVar114 = fVar108;
                                        fVar115 = fVar108;
                                        fVar116 = fVar108;
                                        fVar117 = fVar108;
                                        fVar118 = fVar108;
                                        fVar119 = fVar108;
                                      }
                                    }
                                    else {
                                      fVar108 = pfVar69[4];
                                      fVar109 = pfVar69[5];
                                      fVar110 = pfVar69[6];
                                      fVar111 = pfVar69[7];
                                      fVar112 = pfVar69[8];
                                      fVar113 = pfVar69[9];
                                      fVar114 = pfVar69[10];
                                      fVar115 = pfVar69[0xb];
                                      fVar116 = *pfVar69;
                                      fVar117 = pfVar69[1];
                                      fVar118 = pfVar69[2];
                                      fVar119 = pfVar69[3];
                                    }
                                    if (0 < iVar63) {
                                      lVar84 = 0;
                                      do {
                                        fVar120 = pfVar65[lVar84];
                                        fVar116 = fVar116 + *pfVar90 * fVar120;
                                        fVar117 = fVar117 + pfVar90[1] * fVar120;
                                        fVar118 = fVar118 + pfVar90[2] * fVar120;
                                        fVar119 = fVar119 + pfVar90[3] * fVar120;
                                        fVar108 = fVar108 + pfVar90[4] * fVar120;
                                        fVar109 = fVar109 + pfVar90[5] * fVar120;
                                        fVar110 = fVar110 + pfVar90[6] * fVar120;
                                        fVar111 = fVar111 + pfVar90[7] * fVar120;
                                        fVar112 = fVar112 + fVar120 * pfVar90[8];
                                        fVar113 = fVar113 + fVar120 * pfVar90[9];
                                        fVar114 = fVar114 + fVar120 * pfVar90[10];
                                        fVar115 = fVar115 + fVar120 * pfVar90[0xb];
                                        pfVar90 = pfVar90 + 0xc;
                                        lVar84 = lVar84 + 1;
                                      } while (iVar63 != (int)lVar84);
                                    }
                                    if (iVar53 < iVar79) {
                                      *pfVar69 = fVar116;
                                      pfVar69[1] = fVar117;
                                      pfVar69[2] = fVar118;
                                      pfVar69[3] = fVar119;
                                      pfVar69[4] = fVar108;
                                      pfVar69[5] = fVar109;
                                      pfVar69[6] = fVar110;
                                      pfVar69[7] = fVar111;
                                      pfVar69[8] = fVar112;
                                      pfVar69[9] = fVar113;
                                      pfVar69[10] = fVar114;
                                      pfVar69[0xb] = fVar115;
                                    }
                                    else {
                                      *pfVar61 = fVar116;
                                      pfVar61[1] = fVar117;
                                      pfVar61[2] = fVar118;
                                      pfVar61[3] = fVar119;
                                      pfVar61[4] = fVar108;
                                      pfVar61[5] = fVar109;
                                      pfVar61[6] = fVar110;
                                      pfVar61[7] = fVar111;
                                      pfVar61[8] = fVar112;
                                      pfVar61[9] = fVar113;
                                      pfVar61[10] = fVar114;
                                      pfVar61[0xb] = fVar115;
                                      pfVar61 = pfVar61 + 0xc;
                                    }
                                    pfVar69 = pfVar69 + 0xc;
                                    uVar71 = uVar62 + 0xc;
                                    iVar52 = uVar62 + 0x17;
                                    uVar62 = uVar71;
                                  } while (iVar52 < (int)uVar81);
                                }
                                iVar52 = uVar71 + 7;
                                while (iVar52 < (int)uVar81) {
                                  if (iVar68 == 0) {
                                    if (pfVar58 == (float *)0x0) {
                                      fVar112 = 0.0;
                                      fVar113 = 0.0;
                                      fVar114 = 0.0;
                                      fVar115 = 0.0;
                                      fVar108 = 0.0;
                                      fVar109 = 0.0;
                                      fVar110 = 0.0;
                                      fVar111 = 0.0;
                                    }
                                    else {
                                      fVar108 = *pfVar58;
                                      fVar109 = fVar108;
                                      fVar110 = fVar108;
                                      fVar111 = fVar108;
                                      fVar112 = fVar108;
                                      fVar113 = fVar108;
                                      fVar114 = fVar108;
                                      fVar115 = fVar108;
                                    }
                                  }
                                  else {
                                    fVar108 = pfVar69[4];
                                    fVar109 = pfVar69[5];
                                    fVar110 = pfVar69[6];
                                    fVar111 = pfVar69[7];
                                    fVar112 = *pfVar69;
                                    fVar113 = pfVar69[1];
                                    fVar114 = pfVar69[2];
                                    fVar115 = pfVar69[3];
                                  }
                                  if (0 < iVar63) {
                                    lVar84 = 0;
                                    do {
                                      fVar116 = pfVar65[lVar84];
                                      fVar112 = fVar112 + *pfVar90 * fVar116;
                                      fVar113 = fVar113 + pfVar90[1] * fVar116;
                                      fVar114 = fVar114 + pfVar90[2] * fVar116;
                                      fVar115 = fVar115 + pfVar90[3] * fVar116;
                                      fVar108 = fVar108 + fVar116 * pfVar90[4];
                                      fVar109 = fVar109 + fVar116 * pfVar90[5];
                                      fVar110 = fVar110 + fVar116 * pfVar90[6];
                                      fVar111 = fVar111 + fVar116 * pfVar90[7];
                                      pfVar90 = pfVar90 + 8;
                                      lVar84 = lVar84 + 1;
                                    } while (iVar63 != (int)lVar84);
                                  }
                                  if (iVar53 < iVar79) {
                                    *pfVar69 = fVar112;
                                    pfVar69[1] = fVar113;
                                    pfVar69[2] = fVar114;
                                    pfVar69[3] = fVar115;
                                    pfVar69[4] = fVar108;
                                    pfVar69[5] = fVar109;
                                    pfVar69[6] = fVar110;
                                    pfVar69[7] = fVar111;
                                  }
                                  else {
                                    *pfVar61 = fVar112;
                                    pfVar61[1] = fVar113;
                                    pfVar61[2] = fVar114;
                                    pfVar61[3] = fVar115;
                                    pfVar61[4] = fVar108;
                                    pfVar61[5] = fVar109;
                                    pfVar61[6] = fVar110;
                                    pfVar61[7] = fVar111;
                                    pfVar61 = pfVar61 + 8;
                                  }
                                  pfVar69 = pfVar69 + 8;
                                  iVar52 = uVar71 + 0xf;
                                  uVar71 = uVar71 + 8;
                                }
                                uVar62 = uVar71 | 3;
                                while ((int)uVar62 < (int)uVar81) {
                                  if (iVar68 == 0) {
                                    if (pfVar58 == (float *)0x0) {
                                      fVar108 = 0.0;
                                      fVar109 = 0.0;
                                      fVar110 = 0.0;
                                      fVar111 = 0.0;
                                    }
                                    else {
                                      fVar108 = *pfVar58;
                                      fVar109 = fVar108;
                                      fVar110 = fVar108;
                                      fVar111 = fVar108;
                                    }
                                  }
                                  else {
                                    fVar108 = *pfVar69;
                                    fVar109 = pfVar69[1];
                                    fVar110 = pfVar69[2];
                                    fVar111 = pfVar69[3];
                                  }
                                  if (0 < iVar63) {
                                    lVar84 = 0;
                                    do {
                                      fVar112 = pfVar65[lVar84];
                                      fVar108 = fVar108 + fVar112 * *pfVar90;
                                      fVar109 = fVar109 + fVar112 * pfVar90[1];
                                      fVar110 = fVar110 + fVar112 * pfVar90[2];
                                      fVar111 = fVar111 + fVar112 * pfVar90[3];
                                      pfVar90 = pfVar90 + 4;
                                      lVar84 = lVar84 + 1;
                                    } while (iVar63 != (int)lVar84);
                                  }
                                  if (iVar53 < iVar79) {
                                    *pfVar69 = fVar108;
                                    pfVar69[1] = fVar109;
                                    pfVar69[2] = fVar110;
                                    pfVar69[3] = fVar111;
                                  }
                                  else {
                                    *pfVar61 = fVar108;
                                    pfVar61[1] = fVar109;
                                    pfVar61[2] = fVar110;
                                    pfVar61[3] = fVar111;
                                    pfVar61 = pfVar61 + 4;
                                  }
                                  pfVar69 = pfVar69 + 4;
                                  uVar62 = uVar71 + 7;
                                  uVar71 = uVar71 + 4;
                                }
                                uVar62 = uVar71 | 1;
                                while ((int)uVar62 < (int)uVar81) {
                                  if (iVar68 == 0) {
                                    if (pfVar58 == (float *)0x0) {
                                      fVar108 = 0.0;
                                      fVar109 = 0.0;
                                    }
                                    else {
                                      fVar108 = *pfVar58;
                                      fVar109 = fVar108;
                                    }
                                  }
                                  else {
                                    fVar108 = *pfVar69;
                                    fVar109 = pfVar69[1];
                                  }
                                  if (0 < iVar63) {
                                    lVar84 = 0;
                                    lVar54 = 0;
                                    do {
                                      fVar108 = fVar108 + pfVar65[lVar54] *
                                                          (float)*(undefined8 *)
                                                                  (pfVar90 + lVar54 * 2);
                                      fVar109 = fVar109 + pfVar65[lVar54] *
                                                          (float)((ulong)*(undefined8 *)
                                                                          (pfVar90 + lVar54 * 2) >>
                                                                 0x20);
                                      lVar54 = lVar54 + 1;
                                      lVar84 = lVar84 + -8;
                                    } while (iVar63 != (int)lVar54);
                                    pfVar90 = (float *)((long)pfVar90 - lVar84);
                                  }
                                  if (iVar53 < iVar79) {
                                    *pfVar69 = fVar108;
                                    pfVar69[1] = fVar109;
                                  }
                                  else {
                                    *pfVar61 = fVar108;
                                    pfVar61[1] = fVar109;
                                    pfVar61 = pfVar61 + 2;
                                  }
                                  pfVar69 = pfVar69 + 2;
                                  uVar62 = uVar71 + 3;
                                  uVar71 = uVar71 + 2;
                                }
                                if ((int)uVar71 < (int)uVar81) {
                                  do {
                                    fVar108 = 0.0;
                                    if (pfVar58 != (float *)0x0 || iVar68 != 0) {
                                      pfVar76 = pfVar58;
                                      if (iVar68 != 0) {
                                        pfVar76 = pfVar69;
                                      }
                                      fVar108 = *pfVar76;
                                    }
                                    if (0 < iVar63) {
                                      lVar84 = 0;
                                      do {
                                        fVar108 = fVar108 + *pfVar90 * pfVar65[lVar84];
                                        pfVar90 = pfVar90 + 1;
                                        lVar84 = lVar84 + 1;
                                      } while (iVar63 != (int)lVar84);
                                    }
                                    if (iVar53 < iVar79) {
                                      *pfVar69 = fVar108;
                                    }
                                    else {
                                      *pfVar61 = fVar108;
                                      pfVar61 = pfVar61 + 1;
                                    }
                                    pfVar69 = pfVar69 + 1;
                                    uVar71 = uVar71 + 1;
                                  } while (uVar71 != uVar81);
                                }
                                uVar73 = uVar73 + 1;
                                pfVar65 = pfVar65 + iVar63;
                                pfVar61 = pfVar58;
                              } while (uVar73 != uVar83);
                            }
                            iVar68 = iVar68 + TILE_K;
                            uVar73 = local_160;
                            uVar71 = TILE_N;
                            iVar52 = TILE_K;
                          } while (iVar68 < iVar79);
                        }
                        iVar77 = iVar77 + uVar71;
                        local_16c = iVar80;
                        local_f0 = uVar83;
                      } while (iVar77 < (int)uVar73);
                    }
                    uVar59 = (int)uVar153 + 1;
                    uVar83 = (ulong)uVar59;
                    local_58 = uVar153;
                  } while (uVar59 != local_e0);
                }
                local_1d8 = 0;
              }
              piVar55 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
              if (piVar55 != (int *)0x0) {
                LOCK();
                *piVar55 = *piVar55 + -1;
                UNLOCK();
                if (*piVar55 == 0) {
                  if (local_d8.allocator == (Allocator *)0x0) {
                    if (local_d8.data != (void *)0x0) {
                      free(local_d8.data);
                    }
                  }
                  else {
                    (*(local_d8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar55 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
            if (piVar55 != (int *)0x0) {
              LOCK();
              *piVar55 = *piVar55 + -1;
              UNLOCK();
              if (*piVar55 == 0) {
                if (local_148.allocator == (Allocator *)0x0) {
                  if (local_148.data != (void *)0x0) {
                    free(local_148.data);
                  }
                }
                else {
                  (*(local_148.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            if (local_1d8 == 0) {
              pLVar4 = this->activation;
              local_1d8 = 0;
              if (pLVar4 != (Layer *)0x0) {
                (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
              }
            }
          }
        }
      }
    }
LAB_001581f0:
    piVar55 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar55 == (int *)0x0) {
      return local_1d8;
    }
    LOCK();
    *piVar55 = *piVar55 + -1;
    UNLOCK();
    if (*piVar55 != 0) {
      return local_1d8;
    }
    if (local_1b8.allocator != (Allocator *)0x0) {
      (*(local_1b8.allocator)->_vptr_Allocator[3])();
      return local_1d8;
    }
    local_1b8.allocator = (Allocator *)0x0;
    __ptr = local_1b8.data;
    goto joined_r0x00158292;
  }
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize._0_4_ = 0;
  local_148.elemsize._4_4_ = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  if ((bottom_blob->elemsize & 0xf) == 0) {
    if (&local_148 == bottom_blob) {
      local_148.c = bottom_blob->w;
    }
    else {
      piVar55 = bottom_blob->refcount;
      if (piVar55 != (int *)0x0) {
        LOCK();
        *piVar55 = *piVar55 + 1;
        UNLOCK();
      }
      local_148.data = bottom_blob->data;
      local_148.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
      local_148.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
      local_148.elemsize._0_4_ = (uint)bottom_blob->elemsize;
      local_148.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
      local_148.elempack = bottom_blob->elempack;
      local_148.allocator = bottom_blob->allocator;
      local_148.c = bottom_blob->w;
      local_148.d = bottom_blob->d;
    }
    local_148.dims = 3;
    local_148.w = 1;
    local_148.h = 1;
    local_148.cstep = 1;
LAB_0015a8a3:
    local_d8.cstep = 0;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 0;
    local_d8.elemsize._4_4_ = 0;
    local_d8.elempack = 0;
    local_d8.allocator = (Allocator *)0x0;
    local_d8.dims = 0;
    local_d8.w = 0;
    local_d8.h = 0;
    local_d8.d = 0;
    local_d8.c = 0;
    local_1d8 = (*(this->super_Convolution).super_Layer._vptr_Layer[7])
                          (this,&local_148,&local_d8,opt);
    if (local_1d8 == 0) {
      if (((uint)local_d8.elemsize & 0xf) == 0) {
        if (&local_d8 != top_blob) {
          piVar55 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          if (piVar55 != (int *)0x0) {
            LOCK();
            *piVar55 = *piVar55 + 1;
            UNLOCK();
          }
          piVar55 = top_blob->refcount;
          if (piVar55 != (int *)0x0) {
            LOCK();
            *piVar55 = *piVar55 + -1;
            UNLOCK();
            if (*piVar55 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_d8.data;
          top_blob->refcount = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          top_blob->elemsize = CONCAT44(local_d8.elemsize._4_4_,(uint)local_d8.elemsize);
          top_blob->elempack = local_d8.elempack;
          top_blob->allocator = local_d8.allocator;
          top_blob->dims = local_d8.dims;
          top_blob->w = local_d8.w;
          top_blob->h = local_d8.h;
          top_blob->d = local_d8.d;
          top_blob->c = local_d8.c;
          top_blob->cstep = local_d8.cstep;
        }
        top_blob->dims = 1;
        top_blob->w = local_d8.c;
        top_blob->h = 1;
        top_blob->c = 1;
        local_148.cstep = (size_t)local_d8.c;
      }
      else {
        Mat::reshape(&local_1b8,&local_d8,local_d8.c,opt->blob_allocator);
        piVar55 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (&local_1b8 != top_blob) {
          if (piVar55 != (int *)0x0) {
            LOCK();
            *piVar55 = *piVar55 + 1;
            UNLOCK();
          }
          piVar55 = top_blob->refcount;
          if (piVar55 != (int *)0x0) {
            LOCK();
            *piVar55 = *piVar55 + -1;
            UNLOCK();
            if (*piVar55 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_1b8.data;
          piVar55 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          top_blob->refcount = piVar55;
          top_blob->elemsize = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
          top_blob->elempack = local_1b8.elempack;
          top_blob->allocator = local_1b8.allocator;
          top_blob->dims = local_1b8.dims;
          top_blob->w = local_1b8.w;
          top_blob->h = local_1b8.h;
          top_blob->d = local_1b8.d;
          top_blob->c = local_1b8.c;
          top_blob->cstep = local_1b8.cstep;
        }
        if (piVar55 != (int *)0x0) {
          LOCK();
          *piVar55 = *piVar55 + -1;
          UNLOCK();
          if (*piVar55 == 0) {
            if (local_1b8.allocator == (Allocator *)0x0) {
              if (local_1b8.data != (void *)0x0) {
                free(local_1b8.data);
              }
            }
            else {
              (*(local_1b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_1d8 = -100;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_0015aacb;
      }
      local_1d8 = 0;
    }
LAB_0015aacb:
    piVar55 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar55 != (int *)0x0) {
      LOCK();
      *piVar55 = *piVar55 + -1;
      UNLOCK();
      if (*piVar55 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    Mat::reshape(&local_d8,bottom_blob,1,1,bottom_blob->w,opt->workspace_allocator);
    piVar55 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar55 != (int *)0x0) {
      LOCK();
      *piVar55 = *piVar55 + 1;
      UNLOCK();
    }
    piVar55 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
    if (piVar55 != (int *)0x0) {
      LOCK();
      *piVar55 = *piVar55 + -1;
      UNLOCK();
      if (*piVar55 == 0) {
        if (local_148.allocator == (Allocator *)0x0) {
          if (local_148.data != (void *)0x0) {
            free(local_148.data);
          }
        }
        else {
          (*(local_148.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar55 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    local_148.data = local_d8.data;
    local_148.refcount._0_4_ = local_d8.refcount._0_4_;
    local_148.refcount._4_4_ = local_d8.refcount._4_4_;
    local_148.elemsize._0_4_ = (uint)local_d8.elemsize;
    local_148.elemsize._4_4_ = local_d8.elemsize._4_4_;
    local_148.elempack = local_d8.elempack;
    local_148.allocator = local_d8.allocator;
    local_148.dims = local_d8.dims;
    local_148.w = local_d8.w;
    local_148.h = local_d8.h;
    local_148.d = local_d8.d;
    local_148.c = local_d8.c;
    local_148.cstep = local_d8.cstep;
    if (piVar55 != (int *)0x0) {
      LOCK();
      *piVar55 = *piVar55 + -1;
      UNLOCK();
      if (*piVar55 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1d8 = -100;
    if ((local_148.data != (void *)0x0) && ((long)local_148.c * local_148.cstep != 0))
    goto LAB_0015a8a3;
  }
  piVar55 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar55 == (int *)0x0) {
    return local_1d8;
  }
  LOCK();
  *piVar55 = *piVar55 + -1;
  UNLOCK();
  if (*piVar55 != 0) {
    return local_1d8;
  }
  if (local_148.allocator != (Allocator *)0x0) {
    (*(local_148.allocator)->_vptr_Allocator[3])();
    return local_1d8;
  }
  local_148.allocator = (Allocator *)0x0;
  __ptr = local_148.data;
joined_r0x00158292:
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return local_1d8;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        Mat bottom_blob_3d;
        if (bottom_blob.elemsize % 16 == 0)
        {
            bottom_blob_3d = bottom_blob;
            bottom_blob_3d.dims = 3;
            bottom_blob_3d.w = 1;
            bottom_blob_3d.h = 1;
            bottom_blob_3d.c = bottom_blob.w;
            bottom_blob_3d.cstep = 1;
        }
        else
        {
            bottom_blob_3d = bottom_blob.reshape(1, 1, bottom_blob.w, opt.workspace_allocator);
            if (bottom_blob_3d.empty())
                return -100;
        }

        Mat top_blob_3d;
        int ret = forward(bottom_blob_3d, top_blob_3d, opt);
        if (ret != 0)
            return ret;

        if (top_blob_3d.elemsize % 16 == 0)
        {
            top_blob = top_blob_3d;
            top_blob.dims = 1;
            top_blob.w = top_blob_3d.c;
            top_blob.h = 1;
            top_blob.c = 1;
            bottom_blob_3d.cstep = top_blob_3d.c;
        }
        else
        {
            top_blob = top_blob_3d.reshape(top_blob_3d.c, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
        }

        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw >= dilation_w && outh >= dilation_h)
        {
            return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
        }
    }

    const int num_input = channels * elempack;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
        bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
        bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

        if (prefer_winograd23 && (!opt.use_winograd23_convolution || weight_winograd23_data.empty()))
        {
            // f23 fallback to f43
            prefer_winograd23 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd63 && (!opt.use_winograd63_convolution || weight_winograd63_data.empty()))
        {
            // f63 fallback to f43
            prefer_winograd63 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd43 && (!opt.use_winograd43_convolution || weight_winograd43_data.empty()))
        {
            // f43 fallback to f63 or f23
            prefer_winograd43 = false;
            if (opt.use_winograd63_convolution && !weight_winograd63_data.empty())
            {
                prefer_winograd63 = true;
            }
            else
            {
                prefer_winograd23 = true;
            }
        }

        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution winograd will use load-time value %d", opt.num_threads, nT);
        }

        int ret = 0;
        if (prefer_winograd23)
        {
            ret = conv3x3s1_winograd23(bottom_blob_bordered, top_blob, weight_winograd23_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd43)
        {
            ret = conv3x3s1_winograd43(bottom_blob_bordered, top_blob, weight_winograd43_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd63)
        {
            ret = conv3x3s1_winograd63(bottom_blob_bordered, top_blob, weight_winograd63_data, bias_data, _nT, opt);
        }
        else
        {
            // should never reach here
        }
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
        }

        int ret = convolution_im2col_gemm(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack16to1_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv2x2s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8to1_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX__

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __SSE2__

    convolution_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);

    return 0;
}